

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  ulong uVar70;
  long lVar71;
  uint uVar72;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ulong uVar73;
  bool bVar74;
  uint uVar75;
  bool bVar76;
  ulong uVar77;
  uint uVar78;
  undefined1 auVar89 [16];
  uint uVar79;
  uint uVar131;
  uint uVar132;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float pp;
  float fVar138;
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar159;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar160 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar199;
  float fVar200;
  undefined1 auVar194 [32];
  float fVar201;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar221;
  undefined1 auVar211 [16];
  float fVar210;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar220;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar222 [16];
  float fVar225;
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  float fVar231;
  undefined1 auVar232 [32];
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar233 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [28];
  float fVar240;
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a18;
  undefined1 local_9c0 [16];
  undefined4 local_9b0;
  uint local_9ac;
  float local_9a8;
  float local_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCHitN local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  uint local_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar246 [64];
  
  PVar1 = prim[1];
  uVar70 = (ulong)(byte)PVar1;
  fVar231 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar86 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar222 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  fVar202 = fVar231 * auVar222._0_4_;
  fVar138 = fVar231 * auVar86._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar84);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar88);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar102 = vpmovsxbd_avx2(auVar80);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar102);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar70 + 6);
  auVar94 = vpmovsxbd_avx2(auVar211);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar77 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar77 + uVar70 + 6);
  auVar100 = vpmovsxbd_avx2(auVar81);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar73 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar92 = vpmovsxbd_avx2(auVar87);
  auVar101 = vcvtdq2ps_avx(auVar92);
  auVar112._4_4_ = fVar138;
  auVar112._0_4_ = fVar138;
  auVar112._8_4_ = fVar138;
  auVar112._12_4_ = fVar138;
  auVar112._16_4_ = fVar138;
  auVar112._20_4_ = fVar138;
  auVar112._24_4_ = fVar138;
  auVar112._28_4_ = fVar138;
  auVar114._8_4_ = 1;
  auVar114._0_8_ = 0x100000001;
  auVar114._12_4_ = 1;
  auVar114._16_4_ = 1;
  auVar114._20_4_ = 1;
  auVar114._24_4_ = 1;
  auVar114._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar104 = ZEXT1632(CONCAT412(fVar231 * auVar86._12_4_,
                                CONCAT48(fVar231 * auVar86._8_4_,
                                         CONCAT44(fVar231 * auVar86._4_4_,fVar138))));
  auVar103 = vpermps_avx2(auVar114,auVar104);
  auVar91 = vpermps_avx512vl(auVar90,auVar104);
  fVar138 = auVar91._0_4_;
  fVar234 = auVar91._4_4_;
  auVar104._4_4_ = fVar234 * auVar96._4_4_;
  auVar104._0_4_ = fVar138 * auVar96._0_4_;
  fVar235 = auVar91._8_4_;
  auVar104._8_4_ = fVar235 * auVar96._8_4_;
  fVar236 = auVar91._12_4_;
  auVar104._12_4_ = fVar236 * auVar96._12_4_;
  fVar207 = auVar91._16_4_;
  auVar104._16_4_ = fVar207 * auVar96._16_4_;
  fVar208 = auVar91._20_4_;
  auVar104._20_4_ = fVar208 * auVar96._20_4_;
  fVar209 = auVar91._24_4_;
  auVar104._24_4_ = fVar209 * auVar96._24_4_;
  auVar104._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar94._4_4_ * fVar234;
  auVar102._0_4_ = auVar94._0_4_ * fVar138;
  auVar102._8_4_ = auVar94._8_4_ * fVar235;
  auVar102._12_4_ = auVar94._12_4_ * fVar236;
  auVar102._16_4_ = auVar94._16_4_ * fVar207;
  auVar102._20_4_ = auVar94._20_4_ * fVar208;
  auVar102._24_4_ = auVar94._24_4_ * fVar209;
  auVar102._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar101._4_4_ * fVar234;
  auVar92._0_4_ = auVar101._0_4_ * fVar138;
  auVar92._8_4_ = auVar101._8_4_ * fVar235;
  auVar92._12_4_ = auVar101._12_4_ * fVar236;
  auVar92._16_4_ = auVar101._16_4_ * fVar207;
  auVar92._20_4_ = auVar101._20_4_ * fVar208;
  auVar92._24_4_ = auVar101._24_4_ * fVar209;
  auVar92._28_4_ = auVar91._28_4_;
  auVar82 = vfmadd231ps_fma(auVar104,auVar103,auVar93);
  auVar83 = vfmadd231ps_fma(auVar102,auVar103,auVar98);
  auVar84 = vfmadd231ps_fma(auVar92,auVar100,auVar103);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar112,auVar95);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar97);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar99,auVar112);
  auVar113._4_4_ = fVar202;
  auVar113._0_4_ = fVar202;
  auVar113._8_4_ = fVar202;
  auVar113._12_4_ = fVar202;
  auVar113._16_4_ = fVar202;
  auVar113._20_4_ = fVar202;
  auVar113._24_4_ = fVar202;
  auVar113._28_4_ = fVar202;
  auVar92 = ZEXT1632(CONCAT412(fVar231 * auVar222._12_4_,
                               CONCAT48(fVar231 * auVar222._8_4_,
                                        CONCAT44(fVar231 * auVar222._4_4_,fVar202))));
  auVar102 = vpermps_avx2(auVar114,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar231 = auVar92._0_4_;
  fVar138 = auVar92._4_4_;
  auVar103._4_4_ = fVar138 * auVar96._4_4_;
  auVar103._0_4_ = fVar231 * auVar96._0_4_;
  fVar234 = auVar92._8_4_;
  auVar103._8_4_ = fVar234 * auVar96._8_4_;
  fVar235 = auVar92._12_4_;
  auVar103._12_4_ = fVar235 * auVar96._12_4_;
  fVar236 = auVar92._16_4_;
  auVar103._16_4_ = fVar236 * auVar96._16_4_;
  fVar207 = auVar92._20_4_;
  auVar103._20_4_ = fVar207 * auVar96._20_4_;
  fVar208 = auVar92._24_4_;
  auVar103._24_4_ = fVar208 * auVar96._24_4_;
  auVar103._28_4_ = 1;
  auVar90._4_4_ = auVar94._4_4_ * fVar138;
  auVar90._0_4_ = auVar94._0_4_ * fVar231;
  auVar90._8_4_ = auVar94._8_4_ * fVar234;
  auVar90._12_4_ = auVar94._12_4_ * fVar235;
  auVar90._16_4_ = auVar94._16_4_ * fVar236;
  auVar90._20_4_ = auVar94._20_4_ * fVar207;
  auVar90._24_4_ = auVar94._24_4_ * fVar208;
  auVar90._28_4_ = auVar96._28_4_;
  auVar94._4_4_ = auVar101._4_4_ * fVar138;
  auVar94._0_4_ = auVar101._0_4_ * fVar231;
  auVar94._8_4_ = auVar101._8_4_ * fVar234;
  auVar94._12_4_ = auVar101._12_4_ * fVar235;
  auVar94._16_4_ = auVar101._16_4_ * fVar236;
  auVar94._20_4_ = auVar101._20_4_ * fVar207;
  auVar94._24_4_ = auVar101._24_4_ * fVar208;
  auVar94._28_4_ = auVar92._28_4_;
  auVar88 = vfmadd231ps_fma(auVar103,auVar102,auVar93);
  auVar80 = vfmadd231ps_fma(auVar90,auVar102,auVar98);
  auVar211 = vfmadd231ps_fma(auVar94,auVar102,auVar100);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar113,auVar95);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar113,auVar97);
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  auVar211 = vfmadd231ps_fma(ZEXT1632(auVar211),auVar113,auVar99);
  auVar95 = vandps_avx(ZEXT1632(auVar82),auVar109);
  auVar111._8_4_ = 0x219392ef;
  auVar111._0_8_ = 0x219392ef219392ef;
  auVar111._12_4_ = 0x219392ef;
  auVar111._16_4_ = 0x219392ef;
  auVar111._20_4_ = 0x219392ef;
  auVar111._24_4_ = 0x219392ef;
  auVar111._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar95,auVar111,1);
  bVar74 = (bool)((byte)uVar77 & 1);
  auVar91._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._0_4_;
  bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._4_4_;
  bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._8_4_;
  bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar83),auVar109);
  uVar77 = vcmpps_avx512vl(auVar95,auVar111,1);
  bVar74 = (bool)((byte)uVar77 & 1);
  auVar105._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._0_4_;
  bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._4_4_;
  bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._8_4_;
  bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar84),auVar109);
  uVar77 = vcmpps_avx512vl(auVar95,auVar111,1);
  bVar74 = (bool)((byte)uVar77 & 1);
  auVar95._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar84._0_4_;
  bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar84._4_4_;
  bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar84._8_4_;
  bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar84._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar91,auVar93,auVar110);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar105);
  auVar83 = vfnmadd213ps_fma(auVar105,auVar93,auVar110);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar84 = vfnmadd213ps_fma(auVar95,auVar93,auVar110);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar93,auVar93);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar88));
  auVar99._4_4_ = auVar82._4_4_ * auVar95._4_4_;
  auVar99._0_4_ = auVar82._0_4_ * auVar95._0_4_;
  auVar99._8_4_ = auVar82._8_4_ * auVar95._8_4_;
  auVar99._12_4_ = auVar82._12_4_ * auVar95._12_4_;
  auVar99._16_4_ = auVar95._16_4_ * 0.0;
  auVar99._20_4_ = auVar95._20_4_ * 0.0;
  auVar99._24_4_ = auVar95._24_4_ * 0.0;
  auVar99._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar88));
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar108._0_4_ = auVar82._0_4_ * auVar95._0_4_;
  auVar108._4_4_ = auVar82._4_4_ * auVar95._4_4_;
  auVar108._8_4_ = auVar82._8_4_ * auVar95._8_4_;
  auVar108._12_4_ = auVar82._12_4_ * auVar95._12_4_;
  auVar108._16_4_ = auVar95._16_4_ * 0.0;
  auVar108._20_4_ = auVar95._20_4_ * 0.0;
  auVar108._24_4_ = auVar95._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar70 * -2 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar80));
  auVar100._4_4_ = auVar83._4_4_ * auVar95._4_4_;
  auVar100._0_4_ = auVar83._0_4_ * auVar95._0_4_;
  auVar100._8_4_ = auVar83._8_4_ * auVar95._8_4_;
  auVar100._12_4_ = auVar83._12_4_ * auVar95._12_4_;
  auVar100._16_4_ = auVar95._16_4_ * 0.0;
  auVar100._20_4_ = auVar95._20_4_ * 0.0;
  auVar100._24_4_ = auVar95._24_4_ * 0.0;
  auVar100._28_4_ = auVar95._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar93);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar80));
  auVar107._0_4_ = auVar83._0_4_ * auVar95._0_4_;
  auVar107._4_4_ = auVar83._4_4_ * auVar95._4_4_;
  auVar107._8_4_ = auVar83._8_4_ * auVar95._8_4_;
  auVar107._12_4_ = auVar83._12_4_ * auVar95._12_4_;
  auVar107._16_4_ = auVar95._16_4_ * 0.0;
  auVar107._20_4_ = auVar95._20_4_ * 0.0;
  auVar107._24_4_ = auVar95._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar70 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar211));
  auVar101._4_4_ = auVar95._4_4_ * auVar84._4_4_;
  auVar101._0_4_ = auVar95._0_4_ * auVar84._0_4_;
  auVar101._8_4_ = auVar95._8_4_ * auVar84._8_4_;
  auVar101._12_4_ = auVar95._12_4_ * auVar84._12_4_;
  auVar101._16_4_ = auVar95._16_4_ * 0.0;
  auVar101._20_4_ = auVar95._20_4_ * 0.0;
  auVar101._24_4_ = auVar95._24_4_ * 0.0;
  auVar101._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar211));
  auVar106._0_4_ = auVar84._0_4_ * auVar95._0_4_;
  auVar106._4_4_ = auVar84._4_4_ * auVar95._4_4_;
  auVar106._8_4_ = auVar84._8_4_ * auVar95._8_4_;
  auVar106._12_4_ = auVar84._12_4_ * auVar95._12_4_;
  auVar106._16_4_ = auVar95._16_4_ * 0.0;
  auVar106._20_4_ = auVar95._20_4_ * 0.0;
  auVar106._24_4_ = auVar95._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar99,auVar108);
  auVar93 = vpminsd_avx2(auVar100,auVar107);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx2(auVar101,auVar106);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar96._4_4_ = uVar159;
  auVar96._0_4_ = uVar159;
  auVar96._8_4_ = uVar159;
  auVar96._12_4_ = uVar159;
  auVar96._16_4_ = uVar159;
  auVar96._20_4_ = uVar159;
  auVar96._24_4_ = uVar159;
  auVar96._28_4_ = uVar159;
  auVar93 = vmaxps_avx512vl(auVar93,auVar96);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar95,auVar93);
  auVar95 = vpmaxsd_avx2(auVar99,auVar108);
  auVar93 = vpmaxsd_avx2(auVar100,auVar107);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx2(auVar101,auVar106);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar97._4_4_ = uVar159;
  auVar97._0_4_ = uVar159;
  auVar97._8_4_ = uVar159;
  auVar97._12_4_ = uVar159;
  auVar97._16_4_ = uVar159;
  auVar97._20_4_ = uVar159;
  auVar97._24_4_ = uVar159;
  auVar97._28_4_ = uVar159;
  auVar93 = vminps_avx512vl(auVar93,auVar97);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar98);
  uVar12 = vpcmpgtd_avx512vl(auVar94,_DAT_01fe9900);
  uVar11 = vcmpps_avx512vl(local_2e0,auVar95,2);
  if ((byte)((byte)uVar11 & (byte)uVar12) == 0) {
    return false;
  }
  local_5a8 = (ulong)(byte)((byte)uVar11 & (byte)uVar12);
  local_510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b0 = prim;
LAB_01d6d80a:
  lVar71 = 0;
  for (uVar77 = local_5a8; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  uVar75 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar75].ptr;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar71 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar71 = *(long *)&pGVar2[1].time_range.upper;
  auVar82 = *(undefined1 (*) [16])(lVar71 + (long)p_Var3 * uVar77);
  auVar83 = *(undefined1 (*) [16])(lVar71 + (uVar77 + 1) * (long)p_Var3);
  auVar84 = *(undefined1 (*) [16])(lVar71 + (uVar77 + 2) * (long)p_Var3);
  local_5a8 = local_5a8 - 1 & local_5a8;
  auVar88 = *(undefined1 (*) [16])(lVar71 + (uVar77 + 3) * (long)p_Var3);
  if (local_5a8 != 0) {
    uVar73 = local_5a8 - 1 & local_5a8;
    for (uVar77 = local_5a8; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar73 != 0) {
      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar211 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar242._4_4_ = uVar159;
  auVar242._0_4_ = uVar159;
  auVar242._8_4_ = uVar159;
  auVar242._12_4_ = uVar159;
  local_400._16_4_ = uVar159;
  local_400._0_16_ = auVar242;
  local_400._20_4_ = uVar159;
  local_400._24_4_ = uVar159;
  local_400._28_4_ = uVar159;
  auVar246 = ZEXT3264(local_400);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar247._4_4_ = uVar159;
  auVar247._0_4_ = uVar159;
  auVar247._8_4_ = uVar159;
  auVar247._12_4_ = uVar159;
  local_420._16_4_ = uVar159;
  local_420._0_16_ = auVar247;
  local_420._20_4_ = uVar159;
  local_420._24_4_ = uVar159;
  local_420._28_4_ = uVar159;
  auVar80 = vunpcklps_avx(auVar242,auVar247);
  fVar231 = *(float *)(ray + k * 4 + 0x60);
  auVar248._4_4_ = fVar231;
  auVar248._0_4_ = fVar231;
  auVar248._8_4_ = fVar231;
  auVar248._12_4_ = fVar231;
  local_440._16_4_ = fVar231;
  local_440._0_16_ = auVar248;
  local_440._20_4_ = fVar231;
  local_440._24_4_ = fVar231;
  local_440._28_4_ = fVar231;
  local_6b0 = vinsertps_avx(auVar80,auVar248,0x28);
  auVar237 = ZEXT1664(local_6b0);
  auVar222._0_4_ = auVar82._0_4_ + auVar83._0_4_ + auVar84._0_4_ + auVar88._0_4_;
  auVar222._4_4_ = auVar82._4_4_ + auVar83._4_4_ + auVar84._4_4_ + auVar88._4_4_;
  auVar222._8_4_ = auVar82._8_4_ + auVar83._8_4_ + auVar84._8_4_ + auVar88._8_4_;
  auVar222._12_4_ = auVar82._12_4_ + auVar83._12_4_ + auVar84._12_4_ + auVar88._12_4_;
  auVar86._8_4_ = 0x3e800000;
  auVar86._0_8_ = 0x3e8000003e800000;
  auVar86._12_4_ = 0x3e800000;
  auVar80 = vmulps_avx512vl(auVar222,auVar86);
  auVar80 = vsubps_avx(auVar80,auVar211);
  auVar80 = vdpps_avx(auVar80,local_6b0,0x7f);
  fVar138 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  auVar241 = ZEXT1664(local_6c0);
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = local_6c0._0_4_;
  auVar81 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
  auVar85 = vfnmadd213ss_fma(auVar81,local_6c0,ZEXT416(0x40000000));
  local_2c0 = auVar80._0_4_ * auVar81._0_4_ * auVar85._0_4_;
  auVar227._4_4_ = local_2c0;
  auVar227._0_4_ = local_2c0;
  auVar227._8_4_ = local_2c0;
  auVar227._12_4_ = local_2c0;
  fStack_990 = local_2c0;
  _local_9a0 = auVar227;
  fStack_98c = local_2c0;
  fStack_988 = local_2c0;
  fStack_984 = local_2c0;
  auVar80 = vfmadd231ps_fma(auVar211,local_6b0,auVar227);
  auVar80 = vblendps_avx(auVar80,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar84 = vsubps_avx(auVar84,auVar80);
  auVar230 = ZEXT1664(auVar84);
  auVar83 = vsubps_avx(auVar83,auVar80);
  auVar233 = ZEXT1664(auVar83);
  auVar88 = vsubps_avx(auVar88,auVar80);
  local_8c0 = vbroadcastss_avx512vl(auVar82);
  auVar258 = ZEXT3264(local_8c0);
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  local_640 = ZEXT1632(auVar82);
  local_8e0 = vpermps_avx512vl(auVar118,local_640);
  auVar250 = ZEXT3264(local_8e0);
  auVar119._8_4_ = 2;
  auVar119._0_8_ = 0x200000002;
  auVar119._12_4_ = 2;
  auVar119._16_4_ = 2;
  auVar119._20_4_ = 2;
  auVar119._24_4_ = 2;
  auVar119._28_4_ = 2;
  local_900 = vpermps_avx512vl(auVar119,local_640);
  auVar251 = ZEXT3264(local_900);
  auVar194._8_4_ = 3;
  auVar194._0_8_ = 0x300000003;
  auVar194._12_4_ = 3;
  auVar194._16_4_ = 3;
  auVar194._20_4_ = 3;
  auVar194._24_4_ = 3;
  auVar194._28_4_ = 3;
  local_920 = vpermps_avx512vl(auVar194,local_640);
  auVar252 = ZEXT3264(local_920);
  local_7e0 = vbroadcastss_avx512vl(auVar83);
  auVar253 = ZEXT3264(local_7e0);
  local_680 = ZEXT1632(auVar83);
  local_940 = vpermps_avx512vl(auVar118,local_680);
  auVar254 = ZEXT3264(local_940);
  local_800 = vpermps_avx512vl(auVar119,local_680);
  auVar255 = ZEXT3264(local_800);
  local_960 = vpermps_avx512vl(auVar194,local_680);
  auVar256 = ZEXT3264(local_960);
  local_820 = vbroadcastss_avx512vl(auVar84);
  auVar257 = ZEXT3264(local_820);
  local_660 = ZEXT1632(auVar84);
  local_840 = vpermps_avx512vl(auVar118,local_660);
  auVar259 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar119,local_660);
  auVar260 = ZEXT3264(local_860);
  local_8a0 = vpermps_avx512vl(auVar194,local_660);
  auVar261 = ZEXT3264(local_8a0);
  local_980 = vbroadcastss_avx512vl(auVar88);
  auVar262 = ZEXT3264(local_980);
  _local_6a0 = ZEXT1632(auVar88);
  local_260 = vpermps_avx512vl(auVar118,_local_6a0);
  local_240 = vpermps_avx512vl(auVar119,_local_6a0);
  local_2a0 = vpermps_avx2(auVar194,_local_6a0);
  auVar82 = vfmadd231ps_fma(ZEXT432((uint)(fVar231 * fVar231)),local_420,local_420);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_400,local_400);
  local_220._0_4_ = auVar82._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar115);
  local_610 = ZEXT416((uint)local_2c0);
  local_2c0 = fVar138 - local_2c0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_4f0 = vpbroadcastd_avx512vl();
  local_a18 = 1;
  uVar72 = 0;
  bVar74 = false;
  local_500 = vpbroadcastd_avx512vl();
  auVar82 = vsqrtss_avx(local_6c0,local_6c0);
  local_9a4 = auVar82._0_4_;
  auVar82 = vsqrtss_avx(local_6c0,local_6c0);
  local_9a8 = auVar82._0_4_;
  local_390 = ZEXT816(0x3f80000000000000);
  auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_280 = local_240;
  do {
    auVar82 = vmovshdup_avx(local_390);
    auVar82 = vsubps_avx(auVar82,local_390);
    local_880._0_4_ = auVar82._0_4_;
    fVar221 = local_880._0_4_ * 0.04761905;
    uVar159 = local_390._0_4_;
    auVar216._4_4_ = uVar159;
    auVar216._0_4_ = uVar159;
    auVar216._8_4_ = uVar159;
    auVar216._12_4_ = uVar159;
    auVar216._16_4_ = uVar159;
    auVar216._20_4_ = uVar159;
    auVar216._24_4_ = uVar159;
    auVar216._28_4_ = uVar159;
    local_880._4_4_ = local_880._0_4_;
    local_880._8_4_ = local_880._0_4_;
    local_880._12_4_ = local_880._0_4_;
    local_880._16_4_ = local_880._0_4_;
    local_880._20_4_ = local_880._0_4_;
    local_880._24_4_ = local_880._0_4_;
    local_880._28_4_ = local_880._0_4_;
    auVar82 = vfmadd231ps_fma(auVar216,local_880,_DAT_01faff20);
    auVar95 = vsubps_avx(auVar224._0_32_,ZEXT1632(auVar82));
    fVar231 = auVar95._0_4_;
    fVar235 = auVar95._4_4_;
    fVar207 = auVar95._8_4_;
    fVar209 = auVar95._12_4_;
    fVar210 = auVar95._16_4_;
    fVar219 = auVar95._20_4_;
    fVar220 = auVar95._24_4_;
    fVar139 = fVar231 * fVar231 * fVar231;
    fVar153 = fVar235 * fVar235 * fVar235;
    auVar33._4_4_ = fVar153;
    auVar33._0_4_ = fVar139;
    fVar154 = fVar207 * fVar207 * fVar207;
    auVar33._8_4_ = fVar154;
    fVar155 = fVar209 * fVar209 * fVar209;
    auVar33._12_4_ = fVar155;
    fVar156 = fVar210 * fVar210 * fVar210;
    auVar33._16_4_ = fVar156;
    fVar157 = fVar219 * fVar219 * fVar219;
    auVar33._20_4_ = fVar157;
    fVar158 = fVar220 * fVar220 * fVar220;
    auVar33._24_4_ = fVar158;
    auVar33._28_4_ = local_880._0_4_;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar96 = vmulps_avx512vl(auVar33,auVar93);
    fVar234 = auVar82._0_4_;
    fVar236 = auVar82._4_4_;
    fVar208 = auVar82._8_4_;
    fVar202 = auVar82._12_4_;
    fVar175 = fVar234 * fVar234 * fVar234;
    fVar199 = fVar236 * fVar236 * fVar236;
    fVar200 = fVar208 * fVar208 * fVar208;
    fVar201 = fVar202 * fVar202 * fVar202;
    auVar65._28_4_ = DAT_01faff20._28_4_;
    auVar65._0_28_ = ZEXT1628(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar175))));
    auVar238._0_4_ = fVar234 * fVar231;
    auVar238._4_4_ = fVar236 * fVar235;
    auVar238._8_4_ = fVar208 * fVar207;
    auVar238._12_4_ = fVar202 * fVar209;
    auVar238._16_4_ = fVar210 * 0.0;
    auVar238._20_4_ = fVar219 * 0.0;
    auVar238._28_36_ = auVar237._28_36_;
    auVar238._24_4_ = fVar220 * 0.0;
    auVar97 = vmulps_avx512vl(auVar65,auVar93);
    fVar240 = auVar97._28_4_ + local_880._0_4_;
    fVar225 = fVar240 + auVar241._28_4_ + auVar224._28_4_;
    auVar34._4_4_ = fVar153 * 0.16666667;
    auVar34._0_4_ = fVar139 * 0.16666667;
    auVar34._8_4_ = fVar154 * 0.16666667;
    auVar34._12_4_ = fVar155 * 0.16666667;
    auVar34._16_4_ = fVar156 * 0.16666667;
    auVar34._20_4_ = fVar157 * 0.16666667;
    auVar34._24_4_ = fVar158 * 0.16666667;
    auVar34._28_4_ = fVar240;
    auVar35._4_4_ =
         (auVar238._4_4_ * fVar235 * 12.0 + auVar238._4_4_ * fVar236 * 6.0 + fVar199 + auVar96._4_4_
         ) * 0.16666667;
    auVar35._0_4_ =
         (auVar238._0_4_ * fVar231 * 12.0 + auVar238._0_4_ * fVar234 * 6.0 + fVar175 + auVar96._0_4_
         ) * 0.16666667;
    auVar35._8_4_ =
         (auVar238._8_4_ * fVar207 * 12.0 + auVar238._8_4_ * fVar208 * 6.0 + fVar200 + auVar96._8_4_
         ) * 0.16666667;
    auVar35._12_4_ =
         (auVar238._12_4_ * fVar209 * 12.0 + auVar238._12_4_ * fVar202 * 6.0 +
         fVar201 + auVar96._12_4_) * 0.16666667;
    auVar35._16_4_ =
         (auVar238._16_4_ * fVar210 * 12.0 + auVar238._16_4_ * 0.0 * 6.0 + auVar96._16_4_ + 0.0) *
         0.16666667;
    auVar35._20_4_ =
         (auVar238._20_4_ * fVar219 * 12.0 + auVar238._20_4_ * 0.0 * 6.0 + auVar96._20_4_ + 0.0) *
         0.16666667;
    auVar35._24_4_ =
         (auVar238._24_4_ * fVar220 * 12.0 + auVar238._24_4_ * 0.0 * 6.0 + auVar96._24_4_ + 0.0) *
         0.16666667;
    auVar35._28_4_ = auVar241._28_4_;
    auVar36._4_4_ =
         (auVar97._4_4_ + fVar153 + auVar238._4_4_ * fVar236 * 12.0 + auVar238._4_4_ * fVar235 * 6.0
         ) * 0.16666667;
    auVar36._0_4_ =
         (auVar97._0_4_ + fVar139 + auVar238._0_4_ * fVar234 * 12.0 + auVar238._0_4_ * fVar231 * 6.0
         ) * 0.16666667;
    auVar36._8_4_ =
         (auVar97._8_4_ + fVar154 + auVar238._8_4_ * fVar208 * 12.0 + auVar238._8_4_ * fVar207 * 6.0
         ) * 0.16666667;
    auVar36._12_4_ =
         (auVar97._12_4_ + fVar155 +
         auVar238._12_4_ * fVar202 * 12.0 + auVar238._12_4_ * fVar209 * 6.0) * 0.16666667;
    auVar36._16_4_ =
         (auVar97._16_4_ + fVar156 + auVar238._16_4_ * 0.0 * 12.0 + auVar238._16_4_ * fVar210 * 6.0)
         * 0.16666667;
    auVar36._20_4_ =
         (auVar97._20_4_ + fVar157 + auVar238._20_4_ * 0.0 * 12.0 + auVar238._20_4_ * fVar219 * 6.0)
         * 0.16666667;
    auVar36._24_4_ =
         (auVar97._24_4_ + fVar158 + auVar238._24_4_ * 0.0 * 12.0 + auVar238._24_4_ * fVar220 * 6.0)
         * 0.16666667;
    auVar36._28_4_ = auVar246._28_4_;
    auVar37._28_4_ = fVar225;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar201 * 0.16666667,
                            CONCAT48(fVar200 * 0.16666667,
                                     CONCAT44(fVar199 * 0.16666667,fVar175 * 0.16666667))));
    auVar96 = vmulps_avx512vl(auVar262._0_32_,auVar37);
    auVar97 = vmulps_avx512vl(local_260,auVar37);
    auVar98 = vmulps_avx512vl(local_280,auVar37);
    auVar38._4_4_ = local_2a0._4_4_ * fVar199 * 0.16666667;
    auVar38._0_4_ = local_2a0._0_4_ * fVar175 * 0.16666667;
    auVar38._8_4_ = local_2a0._8_4_ * fVar200 * 0.16666667;
    auVar38._12_4_ = local_2a0._12_4_ * fVar201 * 0.16666667;
    auVar38._16_4_ = local_2a0._16_4_ * 0.0;
    auVar38._20_4_ = local_2a0._20_4_ * 0.0;
    auVar38._24_4_ = local_2a0._24_4_ * 0.0;
    auVar38._28_4_ = fVar225;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar36,auVar257._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar36,auVar259._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar36,auVar260._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar38,auVar261._0_32_,auVar36);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar35,auVar253._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar35,auVar254._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar35,auVar255._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar256._0_32_,auVar35);
    auVar99 = vfmadd231ps_avx512vl(auVar96,auVar34,auVar258._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar97,auVar34,auVar250._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar98,auVar34,auVar251._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar252._0_32_,auVar34);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar97 = vxorps_avx512vl(auVar95,auVar102);
    auVar98 = vxorps_avx512vl(ZEXT1632(auVar82),auVar102);
    auVar217._0_4_ = auVar98._0_4_ * fVar234;
    auVar217._4_4_ = auVar98._4_4_ * fVar236;
    auVar217._8_4_ = auVar98._8_4_ * fVar208;
    auVar217._12_4_ = auVar98._12_4_ * fVar202;
    auVar217._16_4_ = auVar98._16_4_ * 0.0;
    auVar217._20_4_ = auVar98._20_4_ * 0.0;
    auVar217._24_4_ = auVar98._24_4_ * 0.0;
    auVar217._28_4_ = 0;
    auVar98 = vmulps_avx512vl(auVar238._0_32_,auVar93);
    auVar93 = vsubps_avx(auVar217,auVar98);
    auVar39._4_4_ = auVar97._4_4_ * fVar235 * 0.5;
    auVar39._0_4_ = auVar97._0_4_ * fVar231 * 0.5;
    auVar39._8_4_ = auVar97._8_4_ * fVar207 * 0.5;
    auVar39._12_4_ = auVar97._12_4_ * fVar209 * 0.5;
    auVar39._16_4_ = auVar97._16_4_ * fVar210 * 0.5;
    auVar39._20_4_ = auVar97._20_4_ * fVar219 * 0.5;
    auVar39._24_4_ = auVar97._24_4_ * fVar220 * 0.5;
    auVar39._28_4_ = auVar95._28_4_;
    auVar40._4_4_ = auVar93._4_4_ * 0.5;
    auVar40._0_4_ = auVar93._0_4_ * 0.5;
    auVar40._8_4_ = auVar93._8_4_ * 0.5;
    auVar40._12_4_ = auVar93._12_4_ * 0.5;
    auVar40._16_4_ = auVar93._16_4_ * 0.5;
    auVar40._20_4_ = auVar93._20_4_ * 0.5;
    auVar40._24_4_ = auVar93._24_4_ * 0.5;
    auVar40._28_4_ = auVar93._28_4_;
    auVar41._4_4_ = (auVar98._4_4_ + fVar235 * fVar235) * 0.5;
    auVar41._0_4_ = (auVar98._0_4_ + fVar231 * fVar231) * 0.5;
    auVar41._8_4_ = (auVar98._8_4_ + fVar207 * fVar207) * 0.5;
    auVar41._12_4_ = (auVar98._12_4_ + fVar209 * fVar209) * 0.5;
    auVar41._16_4_ = (auVar98._16_4_ + fVar210 * fVar210) * 0.5;
    auVar41._20_4_ = (auVar98._20_4_ + fVar219 * fVar219) * 0.5;
    auVar41._24_4_ = (auVar98._24_4_ + fVar220 * fVar220) * 0.5;
    auVar41._28_4_ = auVar98._28_4_ + auVar230._28_4_;
    fVar231 = fVar234 * fVar234 * 0.5;
    fVar234 = fVar236 * fVar236 * 0.5;
    fVar235 = fVar208 * fVar208 * 0.5;
    fVar236 = fVar202 * fVar202 * 0.5;
    auVar42._28_4_ = auVar233._28_4_;
    auVar42._0_28_ = ZEXT1628(CONCAT412(fVar236,CONCAT48(fVar235,CONCAT44(fVar234,fVar231))));
    auVar43._4_4_ = auVar262._4_4_ * fVar234;
    auVar43._0_4_ = auVar262._0_4_ * fVar231;
    auVar43._8_4_ = auVar262._8_4_ * fVar235;
    auVar43._12_4_ = auVar262._12_4_ * fVar236;
    auVar43._16_4_ = auVar262._16_4_ * 0.0;
    auVar43._20_4_ = auVar262._20_4_ * 0.0;
    auVar43._24_4_ = auVar262._24_4_ * 0.0;
    auVar43._28_4_ = 0x3f000000;
    auVar95 = vmulps_avx512vl(local_260,auVar42);
    auVar93 = vmulps_avx512vl(local_280,auVar42);
    auVar44._4_4_ = local_2a0._4_4_ * fVar234;
    auVar44._0_4_ = local_2a0._0_4_ * fVar231;
    auVar44._8_4_ = local_2a0._8_4_ * fVar235;
    auVar44._12_4_ = local_2a0._12_4_ * fVar236;
    auVar44._16_4_ = local_2a0._16_4_ * 0.0;
    auVar44._20_4_ = local_2a0._20_4_ * 0.0;
    auVar44._24_4_ = local_2a0._24_4_ * 0.0;
    auVar44._28_4_ = auVar233._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar257._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar41,auVar259._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar41,auVar260._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar44,auVar261._0_32_,auVar41);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar40,auVar253._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar40,auVar254._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar40,auVar255._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar256._0_32_,auVar40);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar39,auVar258._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar39,auVar250._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar39,auVar251._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar252._0_32_,auVar39);
    auVar45._4_4_ = auVar97._4_4_ * fVar221;
    auVar45._0_4_ = auVar97._0_4_ * fVar221;
    auVar45._8_4_ = auVar97._8_4_ * fVar221;
    auVar45._12_4_ = auVar97._12_4_ * fVar221;
    auVar45._16_4_ = auVar97._16_4_ * fVar221;
    auVar45._20_4_ = auVar97._20_4_ * fVar221;
    auVar45._24_4_ = auVar97._24_4_ * fVar221;
    auVar45._28_4_ = auVar246._28_4_;
    auVar246 = ZEXT3264(auVar45);
    auVar46._4_4_ = auVar95._4_4_ * fVar221;
    auVar46._0_4_ = auVar95._0_4_ * fVar221;
    auVar46._8_4_ = auVar95._8_4_ * fVar221;
    auVar46._12_4_ = auVar95._12_4_ * fVar221;
    auVar46._16_4_ = auVar95._16_4_ * fVar221;
    auVar46._20_4_ = auVar95._20_4_ * fVar221;
    auVar46._24_4_ = auVar95._24_4_ * fVar221;
    auVar46._28_4_ = 0x3e2aaaab;
    auVar47._4_4_ = auVar93._4_4_ * fVar221;
    auVar47._0_4_ = auVar93._0_4_ * fVar221;
    auVar47._8_4_ = auVar93._8_4_ * fVar221;
    auVar47._12_4_ = auVar93._12_4_ * fVar221;
    auVar47._16_4_ = auVar93._16_4_ * fVar221;
    auVar47._20_4_ = auVar93._20_4_ * fVar221;
    auVar47._24_4_ = auVar93._24_4_ * fVar221;
    auVar47._28_4_ = 0x40c00000;
    fVar231 = auVar98._0_4_ * fVar221;
    fVar234 = auVar98._4_4_ * fVar221;
    auVar48._4_4_ = fVar234;
    auVar48._0_4_ = fVar231;
    fVar235 = auVar98._8_4_ * fVar221;
    auVar48._8_4_ = fVar235;
    fVar236 = auVar98._12_4_ * fVar221;
    auVar48._12_4_ = fVar236;
    fVar207 = auVar98._16_4_ * fVar221;
    auVar48._16_4_ = fVar207;
    fVar208 = auVar98._20_4_ * fVar221;
    auVar48._20_4_ = fVar208;
    fVar209 = auVar98._24_4_ * fVar221;
    auVar48._24_4_ = fVar209;
    auVar48._28_4_ = fVar221;
    auVar82 = vxorps_avx512vl(auVar261._0_16_,auVar261._0_16_);
    auVar92 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,ZEXT1632(auVar82));
    auVar237 = ZEXT3264(auVar92);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,ZEXT1632(auVar82));
    auVar97 = ZEXT1632(auVar82);
    auVar104 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar97);
    auVar241 = ZEXT3264(auVar104);
    auVar218._0_4_ = fVar231 + auVar96._0_4_;
    auVar218._4_4_ = fVar234 + auVar96._4_4_;
    auVar218._8_4_ = fVar235 + auVar96._8_4_;
    auVar218._12_4_ = fVar236 + auVar96._12_4_;
    auVar218._16_4_ = fVar207 + auVar96._16_4_;
    auVar218._20_4_ = fVar208 + auVar96._20_4_;
    auVar218._24_4_ = fVar209 + auVar96._24_4_;
    auVar218._28_4_ = fVar221 + auVar96._28_4_;
    auVar95 = vmaxps_avx(auVar96,auVar218);
    auVar93 = vminps_avx(auVar96,auVar218);
    auVar90 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar97);
    auVar91 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar97);
    auVar233 = ZEXT3264(auVar91);
    auVar105 = vpermt2ps_avx512vl(auVar46,_DAT_01feed00,auVar97);
    auVar118 = ZEXT1632(auVar82);
    auVar106 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar118);
    auVar96 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar118);
    auVar107 = vsubps_avx512vl(auVar90,auVar96);
    auVar96 = vsubps_avx(auVar92,auVar99);
    auVar230 = ZEXT3264(auVar96);
    auVar97 = vsubps_avx(auVar103,auVar100);
    auVar98 = vsubps_avx(auVar104,auVar101);
    auVar94 = vmulps_avx512vl(auVar97,auVar47);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar46,auVar98);
    auVar108 = vmulps_avx512vl(auVar98,auVar45);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar47,auVar96);
    auVar109 = vmulps_avx512vl(auVar96,auVar46);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar45,auVar97);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar94);
    auVar94 = vmulps_avx512vl(auVar98,auVar98);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar97);
    auVar109 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar96);
    auVar110 = vrcp14ps_avx512vl(auVar109);
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar111 = vfnmadd213ps_avx512vl(auVar110,auVar109,auVar94);
    auVar110 = vfmadd132ps_avx512vl(auVar111,auVar110,auVar110);
    auVar108 = vmulps_avx512vl(auVar108,auVar110);
    auVar111 = vmulps_avx512vl(auVar97,auVar106);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar105,auVar98);
    auVar112 = vmulps_avx512vl(auVar98,auVar91);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar106,auVar96);
    auVar113 = vmulps_avx512vl(auVar96,auVar105);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar91,auVar97);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar111,auVar110);
    auVar108 = vmaxps_avx512vl(auVar108,auVar110);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar110 = vmaxps_avx512vl(auVar107,auVar90);
    auVar95 = vmaxps_avx512vl(auVar95,auVar110);
    auVar110 = vaddps_avx512vl(auVar108,auVar95);
    auVar95 = vminps_avx512vl(auVar107,auVar90);
    auVar95 = vminps_avx(auVar93,auVar95);
    auVar95 = vsubps_avx512vl(auVar95,auVar108);
    auVar21._8_4_ = 0x3f800002;
    auVar21._0_8_ = 0x3f8000023f800002;
    auVar21._12_4_ = 0x3f800002;
    auVar21._16_4_ = 0x3f800002;
    auVar21._20_4_ = 0x3f800002;
    auVar21._24_4_ = 0x3f800002;
    auVar21._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar110,auVar21);
    auVar22._8_4_ = 0x3f7ffffc;
    auVar22._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar22._12_4_ = 0x3f7ffffc;
    auVar22._16_4_ = 0x3f7ffffc;
    auVar22._20_4_ = 0x3f7ffffc;
    auVar22._24_4_ = 0x3f7ffffc;
    auVar22._28_4_ = 0x3f7ffffc;
    local_6e0 = vmulps_avx512vl(auVar95,auVar22);
    auVar95 = vmulps_avx512vl(auVar93,auVar93);
    auVar93 = vrsqrt14ps_avx512vl(auVar109);
    auVar23._8_4_ = 0xbf000000;
    auVar23._0_8_ = 0xbf000000bf000000;
    auVar23._12_4_ = 0xbf000000;
    auVar23._16_4_ = 0xbf000000;
    auVar23._20_4_ = 0xbf000000;
    auVar23._24_4_ = 0xbf000000;
    auVar23._28_4_ = 0xbf000000;
    auVar90 = vmulps_avx512vl(auVar109,auVar23);
    fVar231 = auVar93._0_4_;
    fVar234 = auVar93._4_4_;
    fVar235 = auVar93._8_4_;
    fVar236 = auVar93._12_4_;
    fVar207 = auVar93._16_4_;
    fVar208 = auVar93._20_4_;
    fVar209 = auVar93._24_4_;
    auVar49._4_4_ = fVar234 * fVar234 * fVar234 * auVar90._4_4_;
    auVar49._0_4_ = fVar231 * fVar231 * fVar231 * auVar90._0_4_;
    auVar49._8_4_ = fVar235 * fVar235 * fVar235 * auVar90._8_4_;
    auVar49._12_4_ = fVar236 * fVar236 * fVar236 * auVar90._12_4_;
    auVar49._16_4_ = fVar207 * fVar207 * fVar207 * auVar90._16_4_;
    auVar49._20_4_ = fVar208 * fVar208 * fVar208 * auVar90._20_4_;
    auVar49._24_4_ = fVar209 * fVar209 * fVar209 * auVar90._24_4_;
    auVar49._28_4_ = auVar110._28_4_;
    auVar24._8_4_ = 0x3fc00000;
    auVar24._0_8_ = 0x3fc000003fc00000;
    auVar24._12_4_ = 0x3fc00000;
    auVar24._16_4_ = 0x3fc00000;
    auVar24._20_4_ = 0x3fc00000;
    auVar24._24_4_ = 0x3fc00000;
    auVar24._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar49,auVar93,auVar24);
    auVar90 = vmulps_avx512vl(auVar96,auVar93);
    auVar107 = vmulps_avx512vl(auVar97,auVar93);
    auVar108 = vmulps_avx512vl(auVar98,auVar93);
    auVar109 = vsubps_avx512vl(auVar118,auVar99);
    auVar110 = vsubps_avx512vl(auVar118,auVar100);
    auVar111 = vsubps_avx512vl(auVar118,auVar101);
    auVar112 = vmulps_avx512vl(local_440,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_420,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_400,auVar109);
    auVar113 = vmulps_avx512vl(auVar111,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
    auVar114 = vmulps_avx512vl(local_440,auVar108);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar107,local_420);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar90,local_400);
    auVar108 = vmulps_avx512vl(auVar111,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar107);
    auVar90 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar90);
    auVar107 = vmulps_avx512vl(auVar114,auVar114);
    auVar108 = vsubps_avx512vl(local_220,auVar107);
    auVar115 = vmulps_avx512vl(auVar114,auVar90);
    auVar112 = vsubps_avx512vl(auVar112,auVar115);
    auVar112 = vaddps_avx512vl(auVar112,auVar112);
    auVar115 = vmulps_avx512vl(auVar90,auVar90);
    local_700 = vsubps_avx512vl(auVar113,auVar115);
    auVar95 = vsubps_avx512vl(local_700,auVar95);
    local_780 = vmulps_avx512vl(auVar112,auVar112);
    auVar25._8_4_ = 0x40800000;
    auVar25._0_8_ = 0x4080000040800000;
    auVar25._12_4_ = 0x40800000;
    auVar25._16_4_ = 0x40800000;
    auVar25._20_4_ = 0x40800000;
    auVar25._24_4_ = 0x40800000;
    auVar25._28_4_ = 0x40800000;
    _local_7a0 = vmulps_avx512vl(auVar108,auVar25);
    auVar113 = vmulps_avx512vl(_local_7a0,auVar95);
    auVar113 = vsubps_avx512vl(local_780,auVar113);
    uVar77 = vcmpps_avx512vl(auVar113,auVar118,5);
    bVar66 = (byte)uVar77;
    fVar231 = (float)local_9a0._0_4_;
    fVar234 = (float)local_9a0._4_4_;
    fVar235 = fStack_998;
    fVar236 = fStack_994;
    fVar207 = fStack_990;
    fVar208 = fStack_98c;
    fVar209 = fStack_988;
    fVar202 = fStack_984;
    if (bVar66 == 0) {
LAB_01d6e5ae:
      auVar224 = ZEXT3264(auVar94);
      auVar258 = ZEXT3264(local_8c0);
      auVar250 = ZEXT3264(local_8e0);
      auVar251 = ZEXT3264(local_900);
      auVar252 = ZEXT3264(local_920);
      auVar253 = ZEXT3264(local_7e0);
      auVar254 = ZEXT3264(local_940);
      auVar255 = ZEXT3264(local_800);
      auVar256 = ZEXT3264(local_960);
      auVar257 = ZEXT3264(local_820);
      auVar259 = ZEXT3264(local_840);
      auVar260 = ZEXT3264(local_860);
      auVar261 = ZEXT3264(local_8a0);
      auVar262 = ZEXT3264(local_980);
    }
    else {
      auVar113 = vsqrtps_avx512vl(auVar113);
      auVar115 = vaddps_avx512vl(auVar108,auVar108);
      local_7c0 = vrcp14ps_avx512vl(auVar115);
      auVar94 = vfnmadd213ps_avx512vl(local_7c0,auVar115,auVar94);
      auVar94 = vfmadd132ps_avx512vl(auVar94,local_7c0,local_7c0);
      _local_560 = vxorps_avx512vl(auVar112,auVar102);
      auVar102 = vsubps_avx512vl(_local_560,auVar113);
      auVar102 = vmulps_avx512vl(auVar102,auVar94);
      auVar113 = vsubps_avx512vl(auVar113,auVar112);
      local_540 = vmulps_avx512vl(auVar113,auVar94);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar94,auVar102);
      auVar116._0_4_ =
           (uint)(bVar66 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar94._0_4_;
      bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar76 * auVar113._4_4_ | (uint)!bVar76 * auVar94._4_4_;
      bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar76 * auVar113._8_4_ | (uint)!bVar76 * auVar94._8_4_;
      bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar76 * auVar113._12_4_ | (uint)!bVar76 * auVar94._12_4_;
      bVar76 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar76 * auVar113._16_4_ | (uint)!bVar76 * auVar94._16_4_;
      bVar76 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar76 * auVar113._20_4_ | (uint)!bVar76 * auVar94._20_4_;
      bVar76 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar76 * auVar113._24_4_ | (uint)!bVar76 * auVar94._24_4_;
      bVar76 = SUB81(uVar77 >> 7,0);
      auVar116._28_4_ = (uint)bVar76 * auVar113._28_4_ | (uint)!bVar76 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar94,local_540);
      auVar117._0_4_ =
           (uint)(bVar66 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar94._0_4_;
      bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar76 * auVar113._4_4_ | (uint)!bVar76 * auVar94._4_4_;
      bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar76 * auVar113._8_4_ | (uint)!bVar76 * auVar94._8_4_;
      bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar76 * auVar113._12_4_ | (uint)!bVar76 * auVar94._12_4_;
      bVar76 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar76 * auVar113._16_4_ | (uint)!bVar76 * auVar94._16_4_;
      bVar76 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar76 * auVar113._20_4_ | (uint)!bVar76 * auVar94._20_4_;
      bVar76 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar76 * auVar113._24_4_ | (uint)!bVar76 * auVar94._24_4_;
      bVar76 = SUB81(uVar77 >> 7,0);
      auVar117._28_4_ = (uint)bVar76 * auVar113._28_4_ | (uint)!bVar76 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar94);
      local_580 = vmaxps_avx512vl(local_240,auVar94);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_5a0 = vmulps_avx512vl(local_580,auVar26);
      vandps_avx512vl(auVar108,auVar94);
      uVar73 = vcmpps_avx512vl(local_5a0,local_5a0,1);
      uVar77 = uVar77 & uVar73;
      bVar69 = (byte)uVar77;
      if (bVar69 != 0) {
        uVar73 = vcmpps_avx512vl(auVar95,_DAT_01faff00,2);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar107 = vblendmps_avx512vl(auVar95,auVar94);
        bVar68 = (byte)uVar73;
        uVar79 = (uint)(bVar68 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar68 & 1) * local_5a0._0_4_;
        bVar76 = (bool)((byte)(uVar73 >> 1) & 1);
        uVar78 = (uint)bVar76 * auVar107._4_4_ | (uint)!bVar76 * local_5a0._4_4_;
        bVar76 = (bool)((byte)(uVar73 >> 2) & 1);
        uVar131 = (uint)bVar76 * auVar107._8_4_ | (uint)!bVar76 * local_5a0._8_4_;
        bVar76 = (bool)((byte)(uVar73 >> 3) & 1);
        uVar132 = (uint)bVar76 * auVar107._12_4_ | (uint)!bVar76 * local_5a0._12_4_;
        bVar76 = (bool)((byte)(uVar73 >> 4) & 1);
        uVar133 = (uint)bVar76 * auVar107._16_4_ | (uint)!bVar76 * local_5a0._16_4_;
        bVar76 = (bool)((byte)(uVar73 >> 5) & 1);
        uVar134 = (uint)bVar76 * auVar107._20_4_ | (uint)!bVar76 * local_5a0._20_4_;
        bVar76 = (bool)((byte)(uVar73 >> 6) & 1);
        uVar135 = (uint)bVar76 * auVar107._24_4_ | (uint)!bVar76 * local_5a0._24_4_;
        bVar76 = SUB81(uVar73 >> 7,0);
        uVar136 = (uint)bVar76 * auVar107._28_4_ | (uint)!bVar76 * local_5a0._28_4_;
        auVar116._0_4_ = (bVar69 & 1) * uVar79 | !(bool)(bVar69 & 1) * auVar116._0_4_;
        bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ = bVar76 * uVar78 | !bVar76 * auVar116._4_4_;
        bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ = bVar76 * uVar131 | !bVar76 * auVar116._8_4_;
        bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ = bVar76 * uVar132 | !bVar76 * auVar116._12_4_;
        bVar76 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar116._16_4_ = bVar76 * uVar133 | !bVar76 * auVar116._16_4_;
        bVar76 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar116._20_4_ = bVar76 * uVar134 | !bVar76 * auVar116._20_4_;
        bVar76 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar116._24_4_ = bVar76 * uVar135 | !bVar76 * auVar116._24_4_;
        bVar76 = SUB81(uVar77 >> 7,0);
        auVar116._28_4_ = bVar76 * uVar136 | !bVar76 * auVar116._28_4_;
        auVar95 = vblendmps_avx512vl(auVar94,auVar95);
        bVar76 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar10 = SUB81(uVar73 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar69 & 1) *
             ((uint)(bVar68 & 1) * auVar95._0_4_ | !(bool)(bVar68 & 1) * uVar79) |
             !(bool)(bVar69 & 1) * auVar117._0_4_;
        bVar4 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar4 * ((uint)bVar76 * auVar95._4_4_ | !bVar76 * uVar78) |
             !bVar4 * auVar117._4_4_;
        bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar76 * ((uint)bVar5 * auVar95._8_4_ | !bVar5 * uVar131) |
             !bVar76 * auVar117._8_4_;
        bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar76 * ((uint)bVar6 * auVar95._12_4_ | !bVar6 * uVar132) |
             !bVar76 * auVar117._12_4_;
        bVar76 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar76 * ((uint)bVar7 * auVar95._16_4_ | !bVar7 * uVar133) |
             !bVar76 * auVar117._16_4_;
        bVar76 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar76 * ((uint)bVar8 * auVar95._20_4_ | !bVar8 * uVar134) |
             !bVar76 * auVar117._20_4_;
        bVar76 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar76 * ((uint)bVar9 * auVar95._24_4_ | !bVar9 * uVar135) |
             !bVar76 * auVar117._24_4_;
        bVar76 = SUB81(uVar77 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar76 * ((uint)bVar10 * auVar95._28_4_ | !bVar10 * uVar136) |
             !bVar76 * auVar117._28_4_;
        bVar66 = (~bVar69 | bVar68) & bVar66;
      }
      auVar261 = ZEXT3264(local_8a0);
      if ((bVar66 & 0x7f) == 0) {
        auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar258 = ZEXT3264(local_8c0);
        auVar250 = ZEXT3264(local_8e0);
        auVar251 = ZEXT3264(local_900);
        auVar252 = ZEXT3264(local_920);
        auVar253 = ZEXT3264(local_7e0);
        auVar254 = ZEXT3264(local_940);
        auVar255 = ZEXT3264(local_800);
        auVar256 = ZEXT3264(local_960);
        auVar257 = ZEXT3264(local_820);
        auVar259 = ZEXT3264(local_840);
        auVar260 = ZEXT3264(local_860);
        auVar262 = ZEXT3264(local_980);
      }
      else {
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar106 = vxorps_avx512vl(auVar106,auVar95);
        auVar91 = vxorps_avx512vl(auVar91,auVar95);
        uVar79 = *(uint *)(ray + k * 4 + 0x80);
        auVar105 = vxorps_avx512vl(auVar105,auVar95);
        local_760 = ZEXT416(uVar79);
        auVar82 = vsubss_avx512f(local_760,ZEXT416((uint)local_610._0_4_));
        auVar94 = vbroadcastss_avx512vl(auVar82);
        auVar107 = vminps_avx512vl(auVar94,auVar117);
        auVar64._4_4_ = fStack_2bc;
        auVar64._0_4_ = local_2c0;
        auVar64._8_4_ = fStack_2b8;
        auVar64._12_4_ = fStack_2b4;
        auVar64._16_4_ = fStack_2b0;
        auVar64._20_4_ = fStack_2ac;
        auVar64._24_4_ = fStack_2a8;
        auVar64._28_4_ = fStack_2a4;
        auVar108 = vmaxps_avx512vl(auVar64,auVar116);
        auVar94 = vmulps_avx512vl(auVar47,auVar111);
        auVar94 = vfmadd213ps_avx512vl(auVar110,auVar46,auVar94);
        auVar82 = vfmadd213ps_fma(auVar109,auVar45,auVar94);
        auVar94 = vmulps_avx512vl(local_440,auVar47);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_420,auVar46);
        auVar83 = vfmadd231ps_fma(auVar94,local_400,auVar45);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar83),auVar109);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar11 = vcmpps_avx512vl(auVar109,auVar110,1);
        auVar111 = vxorps_avx512vl(ZEXT1632(auVar82),auVar95);
        auVar113 = vrcp14ps_avx512vl(ZEXT1632(auVar83));
        auVar194 = ZEXT1632(auVar83);
        auVar118 = vxorps_avx512vl(auVar194,auVar95);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar119 = vfnmadd213ps_avx512vl(auVar113,auVar194,auVar94);
        auVar82 = vfmadd132ps_fma(auVar119,auVar113,auVar113);
        fVar210 = auVar82._0_4_ * auVar111._0_4_;
        fVar219 = auVar82._4_4_ * auVar111._4_4_;
        auVar50._4_4_ = fVar219;
        auVar50._0_4_ = fVar210;
        fVar220 = auVar82._8_4_ * auVar111._8_4_;
        auVar50._8_4_ = fVar220;
        fVar221 = auVar82._12_4_ * auVar111._12_4_;
        auVar50._12_4_ = fVar221;
        fVar139 = auVar111._16_4_ * 0.0;
        auVar50._16_4_ = fVar139;
        fVar153 = auVar111._20_4_ * 0.0;
        auVar50._20_4_ = fVar153;
        fVar154 = auVar111._24_4_ * 0.0;
        auVar50._24_4_ = fVar154;
        auVar50._28_4_ = auVar111._28_4_;
        uVar12 = vcmpps_avx512vl(auVar194,auVar118,1);
        bVar69 = (byte)uVar11 | (byte)uVar12;
        auVar245._8_4_ = 0xff800000;
        auVar245._0_8_ = 0xff800000ff800000;
        auVar245._12_4_ = 0xff800000;
        auVar245._16_4_ = 0xff800000;
        auVar245._20_4_ = 0xff800000;
        auVar245._24_4_ = 0xff800000;
        auVar245._28_4_ = 0xff800000;
        auVar113 = vblendmps_avx512vl(auVar50,auVar245);
        auVar120._0_4_ = (uint)(bVar69 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar69 & 1) * -0x800000
        ;
        bVar76 = (bool)(bVar69 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar76 * auVar113._4_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar69 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar76 * auVar113._8_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar69 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar76 * auVar113._12_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar69 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar76 * auVar113._16_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar69 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar76 * auVar113._20_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar69 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar76 * auVar113._24_4_ | (uint)!bVar76 * -0x800000;
        auVar120._28_4_ =
             (uint)(bVar69 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar69 >> 7) * -0x800000;
        auVar113 = vmaxps_avx512vl(auVar108,auVar120);
        auVar246 = ZEXT3264(auVar113);
        uVar12 = vcmpps_avx512vl(auVar194,auVar118,6);
        bVar69 = (byte)uVar11 | (byte)uVar12;
        auVar121._0_4_ = (uint)(bVar69 & 1) * 0x7f800000 | (uint)!(bool)(bVar69 & 1) * (int)fVar210;
        bVar76 = (bool)(bVar69 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar219;
        bVar76 = (bool)(bVar69 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar220;
        bVar76 = (bool)(bVar69 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar221;
        bVar76 = (bool)(bVar69 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar139;
        bVar76 = (bool)(bVar69 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar153;
        bVar76 = (bool)(bVar69 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar154;
        auVar121._28_4_ =
             (uint)(bVar69 >> 7) * 0x7f800000 | (uint)!(bool)(bVar69 >> 7) * auVar111._28_4_;
        auVar107 = vminps_avx512vl(auVar107,auVar121);
        auVar82 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar82),auVar92);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar82),auVar103);
        auVar108 = ZEXT1632(auVar82);
        auVar104 = vsubps_avx512vl(auVar108,auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar106);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar105,auVar103);
        auVar92 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar92);
        auVar103 = vmulps_avx512vl(local_440,auVar106);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_420,auVar105);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_400,auVar91);
        vandps_avx512vl(auVar103,auVar109);
        uVar11 = vcmpps_avx512vl(auVar103,auVar110,1);
        auVar92 = vxorps_avx512vl(auVar92,auVar95);
        auVar104 = vrcp14ps_avx512vl(auVar103);
        auVar95 = vxorps_avx512vl(auVar103,auVar95);
        auVar241 = ZEXT3264(auVar95);
        auVar91 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar94);
        auVar82 = vfmadd132ps_fma(auVar91,auVar104,auVar104);
        fVar210 = auVar82._0_4_ * auVar92._0_4_;
        fVar219 = auVar82._4_4_ * auVar92._4_4_;
        auVar51._4_4_ = fVar219;
        auVar51._0_4_ = fVar210;
        fVar220 = auVar82._8_4_ * auVar92._8_4_;
        auVar51._8_4_ = fVar220;
        fVar221 = auVar82._12_4_ * auVar92._12_4_;
        auVar51._12_4_ = fVar221;
        fVar139 = auVar92._16_4_ * 0.0;
        auVar51._16_4_ = fVar139;
        fVar153 = auVar92._20_4_ * 0.0;
        auVar51._20_4_ = fVar153;
        fVar154 = auVar92._24_4_ * 0.0;
        auVar51._24_4_ = fVar154;
        auVar51._28_4_ = auVar92._28_4_;
        uVar12 = vcmpps_avx512vl(auVar103,auVar95,1);
        bVar69 = (byte)uVar11 | (byte)uVar12;
        auVar27._8_4_ = 0xff800000;
        auVar27._0_8_ = 0xff800000ff800000;
        auVar27._12_4_ = 0xff800000;
        auVar27._16_4_ = 0xff800000;
        auVar27._20_4_ = 0xff800000;
        auVar27._24_4_ = 0xff800000;
        auVar27._28_4_ = 0xff800000;
        auVar91 = vblendmps_avx512vl(auVar51,auVar27);
        auVar122._0_4_ =
             (uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar104._0_4_;
        bVar76 = (bool)(bVar69 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar104._4_4_;
        bVar76 = (bool)(bVar69 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar104._8_4_;
        bVar76 = (bool)(bVar69 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar104._12_4_;
        bVar76 = (bool)(bVar69 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar76 * auVar91._16_4_ | (uint)!bVar76 * auVar104._16_4_;
        bVar76 = (bool)(bVar69 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar76 * auVar91._20_4_ | (uint)!bVar76 * auVar104._20_4_;
        bVar76 = (bool)(bVar69 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar76 * auVar91._24_4_ | (uint)!bVar76 * auVar104._24_4_;
        auVar122._28_4_ =
             (uint)(bVar69 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar104._28_4_;
        _local_720 = vmaxps_avx(auVar113,auVar122);
        auVar233 = ZEXT3264(_local_720);
        uVar12 = vcmpps_avx512vl(auVar103,auVar95,6);
        bVar69 = (byte)uVar11 | (byte)uVar12;
        auVar123._0_4_ = (uint)(bVar69 & 1) * 0x7f800000 | (uint)!(bool)(bVar69 & 1) * (int)fVar210;
        bVar76 = (bool)(bVar69 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar219;
        bVar76 = (bool)(bVar69 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar220;
        bVar76 = (bool)(bVar69 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar221;
        bVar76 = (bool)(bVar69 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar139;
        bVar76 = (bool)(bVar69 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar153;
        bVar76 = (bool)(bVar69 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar154;
        auVar123._28_4_ =
             (uint)(bVar69 >> 7) * 0x7f800000 | (uint)!(bool)(bVar69 >> 7) * auVar92._28_4_;
        local_340 = vminps_avx(auVar107,auVar123);
        auVar237 = ZEXT3264(local_340);
        uVar11 = vcmpps_avx512vl(_local_720,local_340,2);
        bVar66 = bVar66 & 0x7f & (byte)uVar11;
        if (bVar66 == 0) goto LAB_01d6e5ae;
        auVar103 = vmaxps_avx512vl(auVar108,local_6e0);
        auVar95 = vfmadd213ps_avx512vl(auVar102,auVar114,auVar90);
        auVar95 = vmulps_avx512vl(auVar93,auVar95);
        auVar102 = vfmadd213ps_avx512vl(local_540,auVar114,auVar90);
        auVar52._4_4_ = auVar93._4_4_ * auVar102._4_4_;
        auVar52._0_4_ = auVar93._0_4_ * auVar102._0_4_;
        auVar52._8_4_ = auVar93._8_4_ * auVar102._8_4_;
        auVar52._12_4_ = auVar93._12_4_ * auVar102._12_4_;
        auVar52._16_4_ = auVar93._16_4_ * auVar102._16_4_;
        auVar52._20_4_ = auVar93._20_4_ * auVar102._20_4_;
        auVar52._24_4_ = auVar93._24_4_ * auVar102._24_4_;
        auVar52._28_4_ = auVar122._28_4_;
        auVar95 = vminps_avx512vl(auVar95,auVar94);
        auVar59 = ZEXT812(0);
        auVar92 = ZEXT1232(auVar59) << 0x20;
        auVar95 = vmaxps_avx(auVar95,ZEXT1232(auVar59) << 0x20);
        auVar104 = vminps_avx512vl(auVar52,auVar94);
        auVar53._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar95._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar53,local_880,auVar216);
        local_1e0 = ZEXT1632(auVar82);
        auVar95 = vmaxps_avx(auVar104,ZEXT1232(auVar59) << 0x20);
        auVar54._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar95._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar54,local_880,auVar216);
        local_200 = ZEXT1632(auVar82);
        auVar55._4_4_ = auVar103._4_4_ * auVar103._4_4_;
        auVar55._0_4_ = auVar103._0_4_ * auVar103._0_4_;
        auVar55._8_4_ = auVar103._8_4_ * auVar103._8_4_;
        auVar55._12_4_ = auVar103._12_4_ * auVar103._12_4_;
        auVar55._16_4_ = auVar103._16_4_ * auVar103._16_4_;
        auVar55._20_4_ = auVar103._20_4_ * auVar103._20_4_;
        auVar55._24_4_ = auVar103._24_4_ * auVar103._24_4_;
        auVar55._28_4_ = auVar103._28_4_;
        auVar95 = vsubps_avx(local_700,auVar55);
        auVar56._4_4_ = auVar95._4_4_ * (float)local_7a0._4_4_;
        auVar56._0_4_ = auVar95._0_4_ * (float)local_7a0._0_4_;
        auVar56._8_4_ = auVar95._8_4_ * fStack_798;
        auVar56._12_4_ = auVar95._12_4_ * fStack_794;
        auVar56._16_4_ = auVar95._16_4_ * fStack_790;
        auVar56._20_4_ = auVar95._20_4_ * fStack_78c;
        auVar56._24_4_ = auVar95._24_4_ * fStack_788;
        auVar56._28_4_ = auVar103._28_4_;
        auVar102 = vsubps_avx(local_780,auVar56);
        uVar77 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar59) << 0x20,5);
        auVar257 = ZEXT3264(local_820);
        auVar259 = ZEXT3264(local_840);
        auVar260 = ZEXT3264(local_860);
        auVar261 = ZEXT3264(local_8a0);
        if ((byte)uVar77 == 0) {
          uVar77 = 0;
          auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar224 = ZEXT864(0) << 0x20;
          auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar239 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar125._8_4_ = 0xff800000;
          auVar125._0_8_ = 0xff800000ff800000;
          auVar125._12_4_ = 0xff800000;
          auVar125._16_4_ = 0xff800000;
          auVar125._20_4_ = 0xff800000;
          auVar125._24_4_ = 0xff800000;
          auVar125._28_4_ = 0xff800000;
        }
        else {
          uVar73 = vcmpps_avx512vl(auVar102,auVar108,5);
          auVar102 = vsqrtps_avx(auVar102);
          auVar94 = vfnmadd213ps_avx512vl(auVar115,local_7c0,auVar94);
          auVar92 = vfmadd132ps_avx512vl(auVar94,local_7c0,local_7c0);
          auVar94 = vsubps_avx(_local_560,auVar102);
          auVar103 = vmulps_avx512vl(auVar94,auVar92);
          auVar94 = vsubps_avx512vl(auVar102,auVar112);
          auVar91 = vmulps_avx512vl(auVar94,auVar92);
          auVar94 = vfmadd213ps_avx512vl(auVar114,auVar103,auVar90);
          auVar57._4_4_ = auVar93._4_4_ * auVar94._4_4_;
          auVar57._0_4_ = auVar93._0_4_ * auVar94._0_4_;
          auVar57._8_4_ = auVar93._8_4_ * auVar94._8_4_;
          auVar57._12_4_ = auVar93._12_4_ * auVar94._12_4_;
          auVar57._16_4_ = auVar93._16_4_ * auVar94._16_4_;
          auVar57._20_4_ = auVar93._20_4_ * auVar94._20_4_;
          auVar57._24_4_ = auVar93._24_4_ * auVar94._24_4_;
          auVar57._28_4_ = auVar104._28_4_;
          auVar94 = vmulps_avx512vl(local_400,auVar103);
          auVar102 = vmulps_avx512vl(local_420,auVar103);
          auVar92 = vmulps_avx512vl(local_440,auVar103);
          auVar104 = vfmadd213ps_avx512vl(auVar96,auVar57,auVar99);
          auVar94 = vsubps_avx512vl(auVar94,auVar104);
          auVar104 = vfmadd213ps_avx512vl(auVar97,auVar57,auVar100);
          auVar102 = vsubps_avx512vl(auVar102,auVar104);
          auVar82 = vfmadd213ps_fma(auVar57,auVar98,auVar101);
          auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar82));
          auVar239 = auVar92._0_28_;
          auVar92 = vfmadd213ps_avx512vl(auVar114,auVar91,auVar90);
          auVar104 = vmulps_avx512vl(auVar93,auVar92);
          auVar93 = vmulps_avx512vl(local_400,auVar91);
          auVar90 = vmulps_avx512vl(local_420,auVar91);
          auVar105 = vmulps_avx512vl(local_440,auVar91);
          auVar82 = vfmadd213ps_fma(auVar96,auVar104,auVar99);
          auVar92 = vsubps_avx(auVar93,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar97,auVar104,auVar100);
          auVar93 = vsubps_avx512vl(auVar90,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar98,auVar104,auVar101);
          auVar96 = vsubps_avx512vl(auVar105,ZEXT1632(auVar82));
          auVar224 = ZEXT3264(auVar96);
          auVar147._8_4_ = 0x7f800000;
          auVar147._0_8_ = 0x7f8000007f800000;
          auVar147._12_4_ = 0x7f800000;
          auVar147._16_4_ = 0x7f800000;
          auVar147._20_4_ = 0x7f800000;
          auVar147._24_4_ = 0x7f800000;
          auVar147._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar147,auVar103);
          bVar76 = (bool)((byte)uVar73 & 1);
          auVar124._0_4_ = (uint)bVar76 * auVar96._0_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar76 * auVar96._4_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar76 * auVar96._8_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar76 * auVar96._12_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar76 * auVar96._16_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar76 * auVar96._20_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar76 * auVar96._24_4_ | (uint)!bVar76 * 0x7f800000;
          bVar76 = SUB81(uVar73 >> 7,0);
          auVar124._28_4_ = (uint)bVar76 * auVar96._28_4_ | (uint)!bVar76 * 0x7f800000;
          auVar195._8_4_ = 0xff800000;
          auVar195._0_8_ = 0xff800000ff800000;
          auVar195._12_4_ = 0xff800000;
          auVar195._16_4_ = 0xff800000;
          auVar195._20_4_ = 0xff800000;
          auVar195._24_4_ = 0xff800000;
          auVar195._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar195,auVar91);
          bVar76 = (bool)((byte)uVar73 & 1);
          auVar125._0_4_ = (uint)bVar76 * auVar96._0_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar76 * auVar96._4_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar76 * auVar96._8_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar76 * auVar96._12_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar76 * auVar96._16_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar76 * auVar96._20_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar76 * auVar96._24_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = SUB81(uVar73 >> 7,0);
          auVar125._28_4_ = (uint)bVar76 * auVar96._28_4_ | (uint)!bVar76 * -0x800000;
          auVar28._8_4_ = 0x36000000;
          auVar28._0_8_ = 0x3600000036000000;
          auVar28._12_4_ = 0x36000000;
          auVar28._16_4_ = 0x36000000;
          auVar28._20_4_ = 0x36000000;
          auVar28._24_4_ = 0x36000000;
          auVar28._28_4_ = 0x36000000;
          auVar96 = vmulps_avx512vl(local_580,auVar28);
          uVar70 = vcmpps_avx512vl(auVar96,local_5a0,0xe);
          uVar73 = uVar73 & uVar70;
          bVar69 = (byte)uVar73;
          if (bVar69 != 0) {
            uVar70 = vcmpps_avx512vl(auVar95,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar229._8_4_ = 0x7f800000;
            auVar229._0_8_ = 0x7f8000007f800000;
            auVar229._12_4_ = 0x7f800000;
            auVar229._16_4_ = 0x7f800000;
            auVar229._20_4_ = 0x7f800000;
            auVar229._24_4_ = 0x7f800000;
            auVar229._28_4_ = 0x7f800000;
            auVar232._8_4_ = 0xff800000;
            auVar232._0_8_ = 0xff800000ff800000;
            auVar232._12_4_ = 0xff800000;
            auVar232._16_4_ = 0xff800000;
            auVar232._20_4_ = 0xff800000;
            auVar232._24_4_ = 0xff800000;
            auVar232._28_4_ = 0xff800000;
            auVar95 = vblendmps_avx512vl(auVar229,auVar232);
            bVar68 = (byte)uVar70;
            uVar78 = (uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
            bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
            uVar131 = (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * auVar96._4_4_;
            bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
            uVar132 = (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * auVar96._8_4_;
            bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
            uVar133 = (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * auVar96._12_4_;
            bVar76 = (bool)((byte)(uVar70 >> 4) & 1);
            uVar134 = (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * auVar96._16_4_;
            bVar76 = (bool)((byte)(uVar70 >> 5) & 1);
            uVar135 = (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * auVar96._20_4_;
            bVar76 = (bool)((byte)(uVar70 >> 6) & 1);
            uVar136 = (uint)bVar76 * auVar95._24_4_ | (uint)!bVar76 * auVar96._24_4_;
            bVar76 = SUB81(uVar70 >> 7,0);
            uVar137 = (uint)bVar76 * auVar95._28_4_ | (uint)!bVar76 * auVar96._28_4_;
            auVar124._0_4_ = (bVar69 & 1) * uVar78 | !(bool)(bVar69 & 1) * auVar124._0_4_;
            bVar76 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = bVar76 * uVar131 | !bVar76 * auVar124._4_4_;
            bVar76 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = bVar76 * uVar132 | !bVar76 * auVar124._8_4_;
            bVar76 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ = bVar76 * uVar133 | !bVar76 * auVar124._12_4_;
            bVar76 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar124._16_4_ = bVar76 * uVar134 | !bVar76 * auVar124._16_4_;
            bVar76 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar124._20_4_ = bVar76 * uVar135 | !bVar76 * auVar124._20_4_;
            bVar76 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar124._24_4_ = bVar76 * uVar136 | !bVar76 * auVar124._24_4_;
            bVar76 = SUB81(uVar73 >> 7,0);
            auVar124._28_4_ = bVar76 * uVar137 | !bVar76 * auVar124._28_4_;
            auVar95 = vblendmps_avx512vl(auVar232,auVar229);
            bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar70 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar70 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar70 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar70 >> 6) & 1);
            bVar10 = SUB81(uVar70 >> 7,0);
            auVar125._0_4_ =
                 (uint)(bVar69 & 1) *
                 ((uint)(bVar68 & 1) * auVar95._0_4_ | !(bool)(bVar68 & 1) * uVar78) |
                 !(bool)(bVar69 & 1) * auVar125._0_4_;
            bVar4 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar4 * ((uint)bVar76 * auVar95._4_4_ | !bVar76 * uVar131) |
                 !bVar4 * auVar125._4_4_;
            bVar76 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar76 * ((uint)bVar5 * auVar95._8_4_ | !bVar5 * uVar132) |
                 !bVar76 * auVar125._8_4_;
            bVar76 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar76 * ((uint)bVar6 * auVar95._12_4_ | !bVar6 * uVar133) |
                 !bVar76 * auVar125._12_4_;
            bVar76 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar76 * ((uint)bVar7 * auVar95._16_4_ | !bVar7 * uVar134) |
                 !bVar76 * auVar125._16_4_;
            bVar76 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar76 * ((uint)bVar8 * auVar95._20_4_ | !bVar8 * uVar135) |
                 !bVar76 * auVar125._20_4_;
            bVar76 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar76 * ((uint)bVar9 * auVar95._24_4_ | !bVar9 * uVar136) |
                 !bVar76 * auVar125._24_4_;
            bVar76 = SUB81(uVar73 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar76 * ((uint)bVar10 * auVar95._28_4_ | !bVar10 * uVar137) |
                 !bVar76 * auVar125._28_4_;
            uVar77 = (ulong)(byte)((~bVar69 | bVar68) & (byte)uVar77);
          }
        }
        auVar258 = ZEXT3264(local_8c0);
        auVar250 = ZEXT3264(local_8e0);
        auVar251 = ZEXT3264(local_900);
        auVar252 = ZEXT3264(local_920);
        auVar254 = ZEXT3264(local_940);
        auVar256 = ZEXT3264(local_960);
        auVar262 = ZEXT3264(local_980);
        auVar246 = ZEXT3264(local_440);
        auVar230._0_4_ = local_440._0_4_ * auVar224._0_4_;
        auVar230._4_4_ = local_440._4_4_ * auVar224._4_4_;
        auVar230._8_4_ = local_440._8_4_ * auVar224._8_4_;
        auVar230._12_4_ = local_440._12_4_ * auVar224._12_4_;
        auVar230._16_4_ = local_440._16_4_ * auVar224._16_4_;
        auVar230._20_4_ = local_440._20_4_ * auVar224._20_4_;
        auVar230._28_36_ = auVar224._28_36_;
        auVar230._24_4_ = local_440._24_4_ * auVar224._24_4_;
        auVar233 = ZEXT3264(local_420);
        auVar82 = vfmadd231ps_fma(auVar230._0_32_,local_420,auVar93);
        auVar230 = ZEXT3264(local_400);
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_400,auVar92);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar95 = vandps_avx(ZEXT1632(auVar82),auVar228);
        auVar241 = ZEXT3264(_local_720);
        _local_1c0 = _local_720;
        auVar223._8_4_ = 0x3e99999a;
        auVar223._0_8_ = 0x3e99999a3e99999a;
        auVar223._12_4_ = 0x3e99999a;
        auVar223._16_4_ = 0x3e99999a;
        auVar223._20_4_ = 0x3e99999a;
        auVar223._24_4_ = 0x3e99999a;
        auVar223._28_4_ = 0x3e99999a;
        uVar11 = vcmpps_avx512vl(auVar95,auVar223,1);
        local_3e0._0_2_ = (short)uVar11;
        local_360 = vmaxps_avx(_local_720,auVar125);
        auVar95 = vminps_avx(local_340,auVar124);
        uVar11 = vcmpps_avx512vl(_local_720,auVar95,2);
        bVar69 = (byte)uVar11 & bVar66;
        uVar12 = vcmpps_avx512vl(local_360,local_340,2);
        auVar253 = ZEXT3264(local_7e0);
        auVar255 = ZEXT3264(local_800);
        if ((bVar66 & ((byte)uVar12 | (byte)uVar11)) == 0) {
          auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          auVar58._4_4_ = local_440._4_4_ * auVar239._4_4_;
          auVar58._0_4_ = local_440._0_4_ * auVar239._0_4_;
          auVar58._8_4_ = local_440._8_4_ * auVar239._8_4_;
          auVar58._12_4_ = local_440._12_4_ * auVar239._12_4_;
          auVar58._16_4_ = local_440._16_4_ * auVar239._16_4_;
          auVar58._20_4_ = local_440._20_4_ * auVar239._20_4_;
          auVar58._24_4_ = local_440._24_4_ * auVar239._24_4_;
          auVar58._28_4_ = auVar95._28_4_;
          auVar82 = vfmadd213ps_fma(auVar102,local_420,auVar58);
          auVar82 = vfmadd213ps_fma(auVar94,local_400,ZEXT1632(auVar82));
          auVar95 = vandps_avx(ZEXT1632(auVar82),auVar228);
          uVar11 = vcmpps_avx512vl(auVar95,auVar223,1);
          local_9b0 = (undefined4)CONCAT71((int7)(uVar77 >> 8),~(byte)uVar77);
          bVar68 = (byte)uVar11 | ~(byte)uVar77;
          auVar149._8_4_ = 2;
          auVar149._0_8_ = 0x200000002;
          auVar149._12_4_ = 2;
          auVar149._16_4_ = 2;
          auVar149._20_4_ = 2;
          auVar149._24_4_ = 2;
          auVar149._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar95 = vpblendmd_avx512vl(auVar149,auVar29);
          local_300._0_4_ = (uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
          bVar76 = (bool)(bVar68 >> 1 & 1);
          local_300._4_4_ = (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar68 >> 2 & 1);
          local_300._8_4_ = (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar68 >> 3 & 1);
          local_300._12_4_ = (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar68 >> 4 & 1);
          local_300._16_4_ = (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar68 >> 5 & 1);
          local_300._20_4_ = (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar68 >> 6 & 1);
          local_300._24_4_ = (uint)bVar76 * auVar95._24_4_ | (uint)!bVar76 * 2;
          local_300._28_4_ = (uint)(bVar68 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar11 = vpcmpd_avx512vl(local_380,local_300,5);
          local_9ac = (uint)bVar69;
          bVar69 = (byte)uVar11 & bVar69;
          auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          if (bVar69 == 0) {
            auVar151._4_4_ = uVar79;
            auVar151._0_4_ = uVar79;
            auVar151._8_4_ = uVar79;
            auVar151._12_4_ = uVar79;
            auVar151._16_4_ = uVar79;
            auVar151._20_4_ = uVar79;
            auVar151._24_4_ = uVar79;
            auVar151._28_4_ = uVar79;
            auVar95 = local_360;
          }
          else {
            local_320 = local_360;
            auVar83 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar82 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar84 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar88 = vminps_avx(auVar83,auVar84);
            auVar83 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar84 = vmaxps_avx(auVar82,auVar83);
            auVar176._8_4_ = 0x7fffffff;
            auVar176._0_8_ = 0x7fffffff7fffffff;
            auVar176._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar88,auVar176);
            auVar83 = vandps_avx(auVar84,auVar176);
            auVar82 = vmaxps_avx(auVar82,auVar83);
            auVar83 = vmovshdup_avx(auVar82);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            fVar210 = auVar82._0_4_ * 1.9073486e-06;
            local_600 = vshufps_avx(auVar84,auVar84,0xff);
            local_3c0 = (float)local_720._0_4_ + (float)local_9a0._0_4_;
            fStack_3bc = (float)local_720._4_4_ + (float)local_9a0._4_4_;
            fStack_3b8 = fStack_718 + fStack_998;
            fStack_3b4 = fStack_714 + fStack_994;
            fStack_3b0 = fStack_710 + fStack_990;
            fStack_3ac = fStack_70c + fStack_98c;
            fStack_3a8 = fStack_708 + fStack_988;
            fStack_3a4 = fStack_704 + fStack_984;
            do {
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar95 = vblendmps_avx512vl(auVar150,_local_720);
              auVar127._0_4_ =
                   (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 1 & 1);
              auVar127._4_4_ = (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 2 & 1);
              auVar127._8_4_ = (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 3 & 1);
              auVar127._12_4_ = (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 4 & 1);
              auVar127._16_4_ = (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 5 & 1);
              auVar127._20_4_ = (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * 0x7f800000;
              auVar127._24_4_ =
                   (uint)(bVar69 >> 6) * auVar95._24_4_ | (uint)!(bool)(bVar69 >> 6) * 0x7f800000;
              auVar127._28_4_ = 0x7f800000;
              auVar95 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar95 = vminps_avx(auVar127,auVar95);
              auVar93 = vshufpd_avx(auVar95,auVar95,5);
              auVar95 = vminps_avx(auVar95,auVar93);
              auVar93 = vpermpd_avx2(auVar95,0x4e);
              auVar95 = vminps_avx(auVar95,auVar93);
              uVar11 = vcmpps_avx512vl(auVar127,auVar95,0);
              bVar67 = (byte)uVar11 & bVar69;
              bVar68 = bVar69;
              if (bVar67 != 0) {
                bVar68 = bVar67;
              }
              iVar14 = 0;
              for (uVar79 = (uint)bVar68; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              auVar224 = ZEXT464(*(uint *)(local_1e0 + (uint)(iVar14 << 2)));
              auVar233 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar14 << 2)));
              fVar219 = local_9a8;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_880._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar14 << 2)));
                local_780._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar14 << 2)));
                fVar219 = sqrtf((float)local_6c0._0_4_);
                auVar233 = ZEXT1664(local_780._0_16_);
                auVar224 = ZEXT1664(local_880._0_16_);
              }
              bVar76 = true;
              uVar77 = 0;
              do {
                local_780._0_16_ = auVar233._0_16_;
                uVar159 = auVar233._0_4_;
                auVar140._4_4_ = uVar159;
                auVar140._0_4_ = uVar159;
                auVar140._8_4_ = uVar159;
                auVar140._12_4_ = uVar159;
                auVar82 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_6b0);
                fVar236 = auVar224._0_4_;
                fVar209 = 1.0 - fVar236;
                fVar235 = fVar209 * fVar209 * fVar209;
                fVar231 = fVar236 * fVar236;
                fVar208 = fVar236 * fVar231;
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar235),
                                          ZEXT416((uint)fVar208));
                fVar234 = fVar236 * fVar209;
                auVar211 = ZEXT416((uint)fVar209);
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar234 * 6.0)),
                                          ZEXT416((uint)(fVar234 * fVar209)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar208),
                                          ZEXT416((uint)fVar235));
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar209 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar236 * fVar234)));
                fVar235 = fVar235 * 0.16666667;
                fVar236 = (auVar83._0_4_ + auVar88._0_4_) * 0.16666667;
                fVar207 = (auVar84._0_4_ + auVar80._0_4_) * 0.16666667;
                fVar208 = fVar208 * 0.16666667;
                auVar177._0_4_ = fVar208 * (float)local_6a0._0_4_;
                auVar177._4_4_ = fVar208 * (float)local_6a0._4_4_;
                auVar177._8_4_ = fVar208 * fStack_698;
                auVar177._12_4_ = fVar208 * fStack_694;
                auVar212._4_4_ = fVar207;
                auVar212._0_4_ = fVar207;
                auVar212._8_4_ = fVar207;
                auVar212._12_4_ = fVar207;
                auVar83 = vfmadd132ps_fma(auVar212,auVar177,local_660._0_16_);
                auVar178._4_4_ = fVar236;
                auVar178._0_4_ = fVar236;
                auVar178._8_4_ = fVar236;
                auVar178._12_4_ = fVar236;
                auVar83 = vfmadd132ps_fma(auVar178,auVar83,local_680._0_16_);
                auVar161._4_4_ = fVar235;
                auVar161._0_4_ = fVar235;
                auVar161._8_4_ = fVar235;
                auVar161._12_4_ = fVar235;
                auVar83 = vfmadd132ps_fma(auVar161,auVar83,local_640._0_16_);
                local_540._0_16_ = auVar83;
                auVar82 = vsubps_avx(auVar82,auVar83);
                local_6e0._0_16_ = auVar82;
                auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
                local_880._0_16_ = auVar224._0_16_;
                local_700._0_16_ = auVar82;
                if (auVar82._0_4_ < 0.0) {
                  local_7a0._0_4_ = fVar231;
                  local_7c0._0_4_ = fVar234;
                  auVar224._0_4_ = sqrtf(auVar82._0_4_);
                  auVar224._4_60_ = extraout_var;
                  auVar82 = auVar224._0_16_;
                  fVar234 = (float)local_7c0._0_4_;
                  auVar83 = local_880._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  local_7a0._0_4_ = fVar231;
                  auVar83 = auVar224._0_16_;
                }
                local_560._4_4_ = fVar209;
                local_560._0_4_ = fVar209;
                fStack_558 = fVar209;
                fStack_554 = fVar209;
                auVar84 = vfnmsub213ss_fma(auVar83,auVar83,ZEXT416((uint)(fVar234 * 4.0)));
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * 4.0)),auVar211,auVar211);
                fVar231 = fVar209 * -fVar209 * 0.5;
                fVar234 = auVar84._0_4_ * 0.5;
                fVar235 = auVar83._0_4_ * 0.5;
                local_7a0._0_4_ = (float)local_7a0._0_4_ * 0.5;
                auVar203._0_4_ = (float)local_7a0._0_4_ * (float)local_6a0._0_4_;
                auVar203._4_4_ = (float)local_7a0._0_4_ * (float)local_6a0._4_4_;
                auVar203._8_4_ = (float)local_7a0._0_4_ * fStack_698;
                auVar203._12_4_ = (float)local_7a0._0_4_ * fStack_694;
                auVar162._4_4_ = fVar235;
                auVar162._0_4_ = fVar235;
                auVar162._8_4_ = fVar235;
                auVar162._12_4_ = fVar235;
                auVar83 = vfmadd132ps_fma(auVar162,auVar203,local_660._0_16_);
                auVar179._4_4_ = fVar234;
                auVar179._0_4_ = fVar234;
                auVar179._8_4_ = fVar234;
                auVar179._12_4_ = fVar234;
                auVar83 = vfmadd132ps_fma(auVar179,auVar83,local_680._0_16_);
                auVar243._4_4_ = fVar231;
                auVar243._0_4_ = fVar231;
                auVar243._8_4_ = fVar231;
                auVar243._12_4_ = fVar231;
                _local_7a0 = vfmadd132ps_fma(auVar243,auVar83,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7a0,_local_7a0,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar231 = local_580._0_4_;
                auVar83 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar231));
                fVar234 = auVar83._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar231));
                auVar83 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_760._0_4_ = auVar83._0_4_;
                local_7c0._0_4_ = auVar82._0_4_;
                if (fVar231 < -fVar231) {
                  auVar233._0_4_ = sqrtf(fVar231);
                  auVar233._4_60_ = extraout_var_00;
                  auVar82 = ZEXT416((uint)local_7c0._0_4_);
                  auVar84 = auVar233._0_16_;
                  auVar83 = _local_7a0;
                }
                else {
                  auVar84 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar83 = _local_7a0;
                }
                fVar231 = fVar234 * 1.5 + fVar231 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar141._0_4_ = auVar83._0_4_ * fVar231;
                auVar141._4_4_ = auVar83._4_4_ * fVar231;
                auVar141._8_4_ = auVar83._8_4_ * fVar231;
                auVar141._12_4_ = auVar83._12_4_ * fVar231;
                auVar88 = vdpps_avx(local_6e0._0_16_,auVar141,0x7f);
                fVar235 = auVar82._0_4_;
                auVar142._0_4_ = auVar88._0_4_ * auVar88._0_4_;
                auVar142._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar142._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar142._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar80 = vsubps_avx(local_700._0_16_,auVar142);
                fVar234 = auVar80._0_4_;
                auVar163._4_12_ = ZEXT812(0) << 0x20;
                auVar163._0_4_ = fVar234;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
                auVar81 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                if (fVar234 < 0.0) {
                  local_5d0._0_4_ = auVar81._0_4_;
                  local_5f0 = fVar231;
                  fStack_5ec = fVar231;
                  fStack_5e8 = fVar231;
                  fStack_5e4 = fVar231;
                  local_5e0 = auVar85;
                  local_5c0 = auVar88;
                  fVar220 = sqrtf(fVar234);
                  auVar81 = ZEXT416((uint)local_5d0._0_4_);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar82 = ZEXT416((uint)local_7c0._0_4_);
                  auVar83 = _local_7a0;
                  auVar88 = local_5c0;
                  auVar85 = local_5e0;
                  fVar231 = local_5f0;
                  fVar236 = fStack_5ec;
                  fVar207 = fStack_5e8;
                  fVar208 = fStack_5e4;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar220 = auVar80._0_4_;
                  fVar236 = fVar231;
                  fVar207 = fVar231;
                  fVar208 = fVar231;
                }
                auVar246 = ZEXT1664(auVar83);
                auVar241 = ZEXT1664(local_700._0_16_);
                auVar237 = ZEXT1664(local_6e0._0_16_);
                auVar258 = ZEXT3264(local_8c0);
                auVar250 = ZEXT3264(local_8e0);
                auVar251 = ZEXT3264(local_900);
                auVar252 = ZEXT3264(local_920);
                auVar253 = ZEXT3264(local_7e0);
                auVar254 = ZEXT3264(local_940);
                auVar255 = ZEXT3264(local_800);
                auVar256 = ZEXT3264(local_960);
                auVar257 = ZEXT3264(local_820);
                auVar259 = ZEXT3264(local_840);
                auVar260 = ZEXT3264(local_860);
                auVar261 = ZEXT3264(local_8a0);
                auVar262 = ZEXT3264(local_980);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar211,local_880._0_16_);
                auVar80 = vfmadd231ss_fma(auVar211,local_880._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar221 = local_880._0_4_;
                auVar180._0_4_ = fVar221 * (float)local_6a0._0_4_;
                auVar180._4_4_ = fVar221 * (float)local_6a0._4_4_;
                auVar180._8_4_ = fVar221 * fStack_698;
                auVar180._12_4_ = fVar221 * fStack_694;
                auVar204._0_4_ = auVar80._0_4_;
                auVar204._4_4_ = auVar204._0_4_;
                auVar204._8_4_ = auVar204._0_4_;
                auVar204._12_4_ = auVar204._0_4_;
                auVar80 = vfmadd132ps_fma(auVar204,auVar180,local_660._0_16_);
                auVar164._0_4_ = auVar87._0_4_;
                auVar164._4_4_ = auVar164._0_4_;
                auVar164._8_4_ = auVar164._0_4_;
                auVar164._12_4_ = auVar164._0_4_;
                auVar80 = vfmadd132ps_fma(auVar164,auVar80,local_680._0_16_);
                auVar80 = vfmadd132ps_fma(_local_560,auVar80,local_640._0_16_);
                auVar165._0_4_ = auVar80._0_4_ * (float)local_580._0_4_;
                auVar165._4_4_ = auVar80._4_4_ * (float)local_580._0_4_;
                auVar165._8_4_ = auVar80._8_4_ * (float)local_580._0_4_;
                auVar165._12_4_ = auVar80._12_4_ * (float)local_580._0_4_;
                auVar80 = vdpps_avx(auVar83,auVar80,0x7f);
                fVar209 = auVar80._0_4_;
                auVar181._0_4_ = auVar83._0_4_ * fVar209;
                auVar181._4_4_ = auVar83._4_4_ * fVar209;
                auVar181._8_4_ = auVar83._8_4_ * fVar209;
                auVar181._12_4_ = auVar83._12_4_ * fVar209;
                auVar80 = vsubps_avx(auVar165,auVar181);
                fVar209 = (float)local_760._0_4_ * (float)local_5a0._0_4_;
                auVar15._8_4_ = 0x80000000;
                auVar15._0_8_ = 0x8000000080000000;
                auVar15._12_4_ = 0x80000000;
                auVar86 = vxorps_avx512vl(auVar83,auVar15);
                auVar213._0_4_ = fVar231 * auVar80._0_4_ * fVar209;
                auVar213._4_4_ = fVar236 * auVar80._4_4_ * fVar209;
                auVar213._8_4_ = fVar207 * auVar80._8_4_ * fVar209;
                auVar213._12_4_ = fVar208 * auVar80._12_4_ * fVar209;
                auVar80 = vdpps_avx(auVar86,auVar141,0x7f);
                auVar211 = vmaxss_avx(ZEXT416((uint)fVar210),
                                      ZEXT416((uint)((float)local_780._0_4_ *
                                                    fVar219 * 1.9073486e-06)));
                auVar87 = vdivss_avx512f(ZEXT416((uint)fVar210),auVar84);
                auVar84 = vdpps_avx(local_6e0._0_16_,auVar213,0x7f);
                auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar210),auVar211);
                auVar87 = vfmadd213ss_fma(ZEXT416((uint)(fVar235 + 1.0)),auVar87,auVar82);
                auVar82 = vdpps_avx(local_6b0,auVar141,0x7f);
                fVar231 = auVar80._0_4_ + auVar84._0_4_;
                auVar84 = vdpps_avx(local_6e0._0_16_,auVar86,0x7f);
                auVar86 = vmulss_avx512f(auVar85,ZEXT416((uint)(fVar234 * -0.5)));
                auVar85 = vmulss_avx512f(auVar85,auVar85);
                auVar80 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar86 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar86._0_4_ * auVar85._0_4_)));
                auVar85 = vfnmadd231ss_fma(auVar84,auVar88,ZEXT416((uint)fVar231));
                auVar81 = vfnmadd231ss_fma(auVar80,auVar88,auVar82);
                auVar84 = vpermilps_avx(local_540._0_16_,0xff);
                fVar220 = fVar220 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar83,auVar83,0xff);
                auVar80 = vfmsub213ss_fma(auVar85,auVar86,auVar84);
                fVar234 = auVar81._0_4_ * auVar86._0_4_;
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar80._0_4_)),
                                          ZEXT416((uint)fVar231),ZEXT416((uint)fVar234));
                fVar235 = auVar85._0_4_;
                fVar221 = fVar221 - (auVar88._0_4_ * (fVar234 / fVar235) -
                                    fVar220 * (auVar82._0_4_ / fVar235));
                auVar224 = ZEXT464((uint)fVar221);
                fVar139 = (float)local_780._0_4_ -
                          (fVar220 * (fVar231 / fVar235) - auVar88._0_4_ * (auVar80._0_4_ / fVar235)
                          );
                auVar233 = ZEXT464((uint)fVar139);
                auVar16._8_4_ = 0x7fffffff;
                auVar16._0_8_ = 0x7fffffff7fffffff;
                auVar16._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx512vl(auVar88,auVar16);
                fVar231 = (float)local_9a0._0_4_;
                fVar234 = (float)local_9a0._4_4_;
                fVar235 = fStack_998;
                fVar236 = fStack_994;
                fVar207 = fStack_990;
                fVar208 = fStack_98c;
                fVar209 = fStack_988;
                fVar202 = fStack_984;
                if (auVar82._0_4_ < auVar87._0_4_) {
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar211._0_4_)),
                                            local_600,ZEXT416(0x36000000));
                  auVar17._8_4_ = 0x7fffffff;
                  auVar17._0_8_ = 0x7fffffff7fffffff;
                  auVar17._12_4_ = 0x7fffffff;
                  auVar88 = vandps_avx512vl(ZEXT416((uint)fVar220),auVar17);
                  if (auVar88._0_4_ < auVar82._0_4_) {
                    fVar219 = fVar139 + (float)local_610._0_4_;
                    auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar138 <= fVar219) {
                      fVar220 = *(float *)(ray + k * 4 + 0x80);
                      bVar68 = 0;
                      if (((fVar220 < fVar219) || (fVar221 < 0.0)) || (bVar68 = 0, 1.0 < fVar221))
                      goto LAB_01d6f0ae;
                      auVar182._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar182._0_4_ = local_700._0_4_;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar182);
                      fVar153 = auVar82._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar75].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar68 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01d6f0ae;
                        fVar153 = fVar153 * 1.5 +
                                  local_700._0_4_ * -0.5 * fVar153 * fVar153 * fVar153;
                        auVar183._0_4_ = local_6e0._0_4_ * fVar153;
                        auVar183._4_4_ = local_6e0._4_4_ * fVar153;
                        auVar183._8_4_ = local_6e0._8_4_ * fVar153;
                        auVar183._12_4_ = local_6e0._12_4_ * fVar153;
                        auVar80 = vfmadd213ps_fma(auVar84,auVar183,auVar83);
                        auVar82 = vshufps_avx(auVar183,auVar183,0xc9);
                        auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
                        auVar184._0_4_ = auVar183._0_4_ * auVar84._0_4_;
                        auVar184._4_4_ = auVar183._4_4_ * auVar84._4_4_;
                        auVar184._8_4_ = auVar183._8_4_ * auVar84._8_4_;
                        auVar184._12_4_ = auVar183._12_4_ * auVar84._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar184,auVar83,auVar82);
                        auVar82 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar84 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                        auVar143._0_4_ = auVar80._0_4_ * auVar88._0_4_;
                        auVar143._4_4_ = auVar80._4_4_ * auVar88._4_4_;
                        auVar143._8_4_ = auVar80._8_4_ * auVar88._8_4_;
                        auVar143._12_4_ = auVar80._12_4_ * auVar88._12_4_;
                        auVar82 = vfmsub231ps_fma(auVar143,auVar82,auVar84);
                        local_4e0 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                        auStack_4d0 = vshufps_avx(auVar82,auVar82,0xaa);
                        local_4c0 = auVar82._0_4_;
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        local_4b0 = fVar221;
                        fStack_4ac = fVar221;
                        fStack_4a8 = fVar221;
                        fStack_4a4 = fVar221;
                        local_4a0 = ZEXT416(0) << 0x20;
                        local_490 = local_4f0._0_8_;
                        uStack_488 = local_4f0._8_8_;
                        local_480 = local_500;
                        vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                        uStack_46c = context->user->instID[0];
                        local_470 = uStack_46c;
                        uStack_468 = uStack_46c;
                        uStack_464 = uStack_46c;
                        uStack_460 = context->user->instPrimID[0];
                        uStack_45c = uStack_460;
                        uStack_458 = uStack_460;
                        uStack_454 = uStack_460;
                        *(float *)(ray + k * 4 + 0x80) = fVar219;
                        local_9c0 = local_510;
                        local_750.valid = (int *)local_9c0;
                        local_750.geometryUserPtr = pGVar2->userPtr;
                        local_750.context = context->user;
                        local_750.hit = local_4e0;
                        local_750.N = 4;
                        local_750.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar233 = ZEXT464((uint)fVar139);
                          auVar237 = ZEXT1664(local_6e0._0_16_);
                          auVar241 = ZEXT1664(local_700._0_16_);
                          auVar246 = ZEXT1664(auVar83);
                          (*pGVar2->occlusionFilterN)(&local_750);
                          auVar262 = ZEXT3264(local_980);
                          auVar261 = ZEXT3264(local_8a0);
                          auVar260 = ZEXT3264(local_860);
                          auVar259 = ZEXT3264(local_840);
                          auVar257 = ZEXT3264(local_820);
                          auVar256 = ZEXT3264(local_960);
                          auVar255 = ZEXT3264(local_800);
                          auVar254 = ZEXT3264(local_940);
                          auVar253 = ZEXT3264(local_7e0);
                          auVar252 = ZEXT3264(local_920);
                          auVar251 = ZEXT3264(local_900);
                          auVar250 = ZEXT3264(local_8e0);
                          auVar258 = ZEXT3264(local_8c0);
                          auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          fVar231 = (float)local_9a0._0_4_;
                          fVar234 = (float)local_9a0._4_4_;
                          fVar235 = fStack_998;
                          fVar236 = fStack_994;
                          fVar207 = fStack_990;
                          fVar208 = fStack_98c;
                          fVar209 = fStack_988;
                          fVar202 = fStack_984;
                        }
                        uVar77 = vptestmd_avx512vl(local_9c0,local_9c0);
                        if ((uVar77 & 0xf) != 0) {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar233 = ZEXT1664(auVar233._0_16_);
                            auVar237 = ZEXT1664(auVar237._0_16_);
                            auVar241 = ZEXT1664(auVar241._0_16_);
                            auVar246 = ZEXT1664(auVar246._0_16_);
                            (*p_Var3)(&local_750);
                            auVar262 = ZEXT3264(local_980);
                            auVar261 = ZEXT3264(local_8a0);
                            auVar260 = ZEXT3264(local_860);
                            auVar259 = ZEXT3264(local_840);
                            auVar257 = ZEXT3264(local_820);
                            auVar256 = ZEXT3264(local_960);
                            auVar255 = ZEXT3264(local_800);
                            auVar254 = ZEXT3264(local_940);
                            auVar253 = ZEXT3264(local_7e0);
                            auVar252 = ZEXT3264(local_920);
                            auVar251 = ZEXT3264(local_900);
                            auVar250 = ZEXT3264(local_8e0);
                            auVar258 = ZEXT3264(local_8c0);
                            auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                                          CONCAT424(0x3f800000,
                                                                    CONCAT420(0x3f800000,
                                                                              CONCAT416(0x3f800000,
                                                                                        CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                            fVar231 = (float)local_9a0._0_4_;
                            fVar234 = (float)local_9a0._4_4_;
                            fVar235 = fStack_998;
                            fVar236 = fStack_994;
                            fVar207 = fStack_990;
                            fVar208 = fStack_98c;
                            fVar209 = fStack_988;
                            fVar202 = fStack_984;
                          }
                          uVar77 = vptestmd_avx512vl(local_9c0,local_9c0);
                          uVar77 = uVar77 & 0xf;
                          auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar4 = (bool)((byte)uVar77 & 1);
                          bVar5 = (bool)((byte)(uVar77 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                          bVar7 = SUB81(uVar77 >> 3,0);
                          *(uint *)(local_750.ray + 0x80) =
                               (uint)bVar4 * auVar82._0_4_ |
                               (uint)!bVar4 * *(int *)(local_750.ray + 0x80);
                          *(uint *)(local_750.ray + 0x84) =
                               (uint)bVar5 * auVar82._4_4_ |
                               (uint)!bVar5 * *(int *)(local_750.ray + 0x84);
                          *(uint *)(local_750.ray + 0x88) =
                               (uint)bVar6 * auVar82._8_4_ |
                               (uint)!bVar6 * *(int *)(local_750.ray + 0x88);
                          *(uint *)(local_750.ray + 0x8c) =
                               (uint)bVar7 * auVar82._12_4_ |
                               (uint)!bVar7 * *(int *)(local_750.ray + 0x8c);
                          bVar68 = 1;
                          if ((byte)uVar77 != 0) goto LAB_01d6f0ae;
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar220;
                        bVar68 = 0;
                        goto LAB_01d6f0ae;
                      }
                    }
                    bVar68 = 0;
                    goto LAB_01d6f0ae;
                  }
                }
                bVar76 = uVar77 < 4;
                uVar77 = uVar77 + 1;
              } while (uVar77 != 5);
              bVar76 = false;
              auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar68 = 5;
LAB_01d6f0ae:
              bVar74 = (bool)(bVar74 | bVar76 & bVar68);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar151._4_4_ = uVar159;
              auVar151._0_4_ = uVar159;
              auVar151._8_4_ = uVar159;
              auVar151._12_4_ = uVar159;
              auVar151._16_4_ = uVar159;
              auVar151._20_4_ = uVar159;
              auVar151._24_4_ = uVar159;
              auVar151._28_4_ = uVar159;
              auVar62._4_4_ = fStack_3bc;
              auVar62._0_4_ = local_3c0;
              auVar62._8_4_ = fStack_3b8;
              auVar62._12_4_ = fStack_3b4;
              auVar62._16_4_ = fStack_3b0;
              auVar62._20_4_ = fStack_3ac;
              auVar62._24_4_ = fStack_3a8;
              auVar62._28_4_ = fStack_3a4;
              uVar11 = vcmpps_avx512vl(auVar151,auVar62,0xd);
              bVar69 = ~('\x01' << ((byte)iVar14 & 0x1f)) & bVar69 & (byte)uVar11;
              auVar95 = local_320;
            } while (bVar69 != 0);
          }
          auVar230 = ZEXT3264(local_360);
          bVar69 = local_3e0[0] | (byte)local_9b0;
          auVar173._0_4_ = fVar231 + auVar95._0_4_;
          auVar173._4_4_ = fVar234 + auVar95._4_4_;
          auVar173._8_4_ = fVar235 + auVar95._8_4_;
          auVar173._12_4_ = fVar236 + auVar95._12_4_;
          auVar173._16_4_ = fVar207 + auVar95._16_4_;
          auVar173._20_4_ = fVar208 + auVar95._20_4_;
          auVar173._24_4_ = fVar209 + auVar95._24_4_;
          auVar173._28_4_ = fVar202 + auVar95._28_4_;
          uVar11 = vcmpps_avx512vl(auVar173,auVar151,2);
          bVar66 = (byte)uVar12 & bVar66 & (byte)uVar11;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar95 = vpblendmd_avx512vl(auVar174,auVar30);
          auVar128._0_4_ = (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * 2;
          bVar76 = (bool)(bVar69 >> 1 & 1);
          auVar128._4_4_ = (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar69 >> 2 & 1);
          auVar128._8_4_ = (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar69 >> 3 & 1);
          auVar128._12_4_ = (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar69 >> 4 & 1);
          auVar128._16_4_ = (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar69 >> 5 & 1);
          auVar128._20_4_ = (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar69 >> 6 & 1);
          auVar128._24_4_ = (uint)bVar76 * auVar95._24_4_ | (uint)!bVar76 * 2;
          auVar128._28_4_ = (uint)(bVar69 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar69 >> 7) * 2;
          uVar11 = vpcmpd_avx512vl(local_380,auVar128,5);
          bVar69 = (byte)uVar11 & bVar66;
          if (bVar69 != 0) {
            local_3e0 = auVar128;
            auVar83 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar82 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar84 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar88 = vminps_avx(auVar83,auVar84);
            auVar83 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar84 = vmaxps_avx(auVar82,auVar83);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar88,auVar185);
            auVar83 = vandps_avx(auVar84,auVar185);
            auVar82 = vmaxps_avx(auVar82,auVar83);
            auVar83 = vmovshdup_avx(auVar82);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            fVar210 = auVar82._0_4_ * 1.9073486e-06;
            local_600 = vshufps_avx(auVar84,auVar84,0xff);
            local_3c0 = fVar231 + local_360._0_4_;
            fStack_3bc = fVar234 + local_360._4_4_;
            fStack_3b8 = fVar235 + local_360._8_4_;
            fStack_3b4 = fVar236 + local_360._12_4_;
            fStack_3b0 = fVar207 + local_360._16_4_;
            fStack_3ac = fVar208 + local_360._20_4_;
            fStack_3a8 = fVar209 + local_360._24_4_;
            fStack_3a4 = fVar202 + local_360._28_4_;
            _local_720 = local_360;
            do {
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar95 = vblendmps_avx512vl(auVar152,auVar230._0_32_);
              auVar129._0_4_ =
                   (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 1 & 1);
              auVar129._4_4_ = (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 2 & 1);
              auVar129._8_4_ = (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 3 & 1);
              auVar129._12_4_ = (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 4 & 1);
              auVar129._16_4_ = (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * 0x7f800000;
              bVar76 = (bool)(bVar69 >> 5 & 1);
              auVar129._20_4_ = (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * 0x7f800000;
              auVar129._24_4_ =
                   (uint)(bVar69 >> 6) * auVar95._24_4_ | (uint)!(bool)(bVar69 >> 6) * 0x7f800000;
              auVar129._28_4_ = 0x7f800000;
              auVar95 = vshufps_avx(auVar129,auVar129,0xb1);
              auVar95 = vminps_avx(auVar129,auVar95);
              auVar93 = vshufpd_avx(auVar95,auVar95,5);
              auVar95 = vminps_avx(auVar95,auVar93);
              auVar93 = vpermpd_avx2(auVar95,0x4e);
              auVar95 = vminps_avx(auVar95,auVar93);
              uVar11 = vcmpps_avx512vl(auVar129,auVar95,0);
              bVar67 = (byte)uVar11 & bVar69;
              bVar68 = bVar69;
              if (bVar67 != 0) {
                bVar68 = bVar67;
              }
              iVar14 = 0;
              for (uVar79 = (uint)bVar68; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              auVar224 = ZEXT464(*(uint *)(local_200 + (uint)(iVar14 << 2)));
              auVar233 = ZEXT464(*(uint *)(local_340 + (uint)(iVar14 << 2)));
              fVar219 = local_9a4;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_880._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar14 << 2)));
                local_780._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar14 << 2)));
                fVar219 = sqrtf((float)local_6c0._0_4_);
                auVar233 = ZEXT1664(local_780._0_16_);
                auVar224 = ZEXT1664(local_880._0_16_);
              }
              bVar76 = true;
              uVar77 = 0;
              do {
                local_780._0_16_ = auVar233._0_16_;
                uVar159 = auVar233._0_4_;
                auVar144._4_4_ = uVar159;
                auVar144._0_4_ = uVar159;
                auVar144._8_4_ = uVar159;
                auVar144._12_4_ = uVar159;
                auVar82 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_6b0);
                fVar236 = auVar224._0_4_;
                fVar209 = 1.0 - fVar236;
                fVar235 = fVar209 * fVar209 * fVar209;
                fVar231 = fVar236 * fVar236;
                fVar208 = fVar236 * fVar231;
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar235),
                                          ZEXT416((uint)fVar208));
                fVar234 = fVar236 * fVar209;
                auVar211 = ZEXT416((uint)fVar209);
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar234 * 6.0)),
                                          ZEXT416((uint)(fVar234 * fVar209)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar208),
                                          ZEXT416((uint)fVar235));
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar209 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar236 * fVar234)));
                fVar235 = fVar235 * 0.16666667;
                fVar236 = (auVar83._0_4_ + auVar88._0_4_) * 0.16666667;
                fVar207 = (auVar84._0_4_ + auVar80._0_4_) * 0.16666667;
                fVar208 = fVar208 * 0.16666667;
                auVar186._0_4_ = fVar208 * (float)local_6a0._0_4_;
                auVar186._4_4_ = fVar208 * (float)local_6a0._4_4_;
                auVar186._8_4_ = fVar208 * fStack_698;
                auVar186._12_4_ = fVar208 * fStack_694;
                auVar214._4_4_ = fVar207;
                auVar214._0_4_ = fVar207;
                auVar214._8_4_ = fVar207;
                auVar214._12_4_ = fVar207;
                auVar83 = vfmadd132ps_fma(auVar214,auVar186,local_660._0_16_);
                auVar187._4_4_ = fVar236;
                auVar187._0_4_ = fVar236;
                auVar187._8_4_ = fVar236;
                auVar187._12_4_ = fVar236;
                auVar83 = vfmadd132ps_fma(auVar187,auVar83,local_680._0_16_);
                auVar166._4_4_ = fVar235;
                auVar166._0_4_ = fVar235;
                auVar166._8_4_ = fVar235;
                auVar166._12_4_ = fVar235;
                auVar83 = vfmadd132ps_fma(auVar166,auVar83,local_640._0_16_);
                local_540._0_16_ = auVar83;
                auVar82 = vsubps_avx(auVar82,auVar83);
                local_6e0._0_16_ = auVar82;
                auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
                local_880._0_16_ = auVar224._0_16_;
                local_700._0_16_ = auVar82;
                if (auVar82._0_4_ < 0.0) {
                  local_7a0._0_4_ = fVar231;
                  local_7c0._0_4_ = fVar234;
                  auVar237._0_4_ = sqrtf(auVar82._0_4_);
                  auVar237._4_60_ = extraout_var_01;
                  auVar82 = auVar237._0_16_;
                  fVar234 = (float)local_7c0._0_4_;
                  auVar83 = local_880._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  local_7a0._0_4_ = fVar231;
                  auVar83 = auVar224._0_16_;
                }
                local_560._4_4_ = fVar209;
                local_560._0_4_ = fVar209;
                fStack_558 = fVar209;
                fStack_554 = fVar209;
                auVar84 = vfnmsub213ss_fma(auVar83,auVar83,ZEXT416((uint)(fVar234 * 4.0)));
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * 4.0)),auVar211,auVar211);
                fVar231 = fVar209 * -fVar209 * 0.5;
                fVar234 = auVar84._0_4_ * 0.5;
                fVar235 = auVar83._0_4_ * 0.5;
                local_7a0._0_4_ = (float)local_7a0._0_4_ * 0.5;
                auVar205._0_4_ = (float)local_7a0._0_4_ * (float)local_6a0._0_4_;
                auVar205._4_4_ = (float)local_7a0._0_4_ * (float)local_6a0._4_4_;
                auVar205._8_4_ = (float)local_7a0._0_4_ * fStack_698;
                auVar205._12_4_ = (float)local_7a0._0_4_ * fStack_694;
                auVar167._4_4_ = fVar235;
                auVar167._0_4_ = fVar235;
                auVar167._8_4_ = fVar235;
                auVar167._12_4_ = fVar235;
                auVar83 = vfmadd132ps_fma(auVar167,auVar205,local_660._0_16_);
                auVar188._4_4_ = fVar234;
                auVar188._0_4_ = fVar234;
                auVar188._8_4_ = fVar234;
                auVar188._12_4_ = fVar234;
                auVar83 = vfmadd132ps_fma(auVar188,auVar83,local_680._0_16_);
                auVar244._4_4_ = fVar231;
                auVar244._0_4_ = fVar231;
                auVar244._8_4_ = fVar231;
                auVar244._12_4_ = fVar231;
                _local_7a0 = vfmadd132ps_fma(auVar244,auVar83,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7a0,_local_7a0,0x7f);
                auVar61._12_4_ = 0;
                auVar61._0_12_ = ZEXT812(0);
                fVar231 = local_580._0_4_;
                auVar83 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar231));
                fVar234 = auVar83._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar231));
                auVar83 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_760._0_4_ = auVar83._0_4_;
                local_7c0._0_4_ = auVar82._0_4_;
                if (fVar231 < -fVar231) {
                  auVar241._0_4_ = sqrtf(fVar231);
                  auVar241._4_60_ = extraout_var_02;
                  auVar82 = ZEXT416((uint)local_7c0._0_4_);
                  auVar84 = auVar241._0_16_;
                  auVar83 = _local_7a0;
                }
                else {
                  auVar84 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar83 = _local_7a0;
                }
                fVar231 = fVar234 * 1.5 + fVar231 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar249._0_4_ = auVar83._0_4_ * fVar231;
                auVar249._4_4_ = auVar83._4_4_ * fVar231;
                auVar249._8_4_ = auVar83._8_4_ * fVar231;
                auVar249._12_4_ = auVar83._12_4_ * fVar231;
                auVar88 = vdpps_avx(local_6e0._0_16_,auVar249,0x7f);
                fVar236 = auVar82._0_4_;
                fVar234 = auVar88._0_4_;
                auVar145._0_4_ = fVar234 * fVar234;
                auVar145._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar145._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar145._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar80 = vsubps_avx(local_700._0_16_,auVar145);
                fVar235 = auVar80._0_4_;
                auVar168._4_12_ = ZEXT812(0) << 0x20;
                auVar168._0_4_ = fVar235;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
                auVar81 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                if (fVar235 < 0.0) {
                  local_5c0._0_4_ = auVar84._0_4_;
                  local_5f0 = fVar231;
                  fStack_5ec = fVar231;
                  fStack_5e8 = fVar231;
                  fStack_5e4 = fVar231;
                  local_5e0 = auVar249;
                  local_5d0 = auVar85;
                  fVar220 = sqrtf(fVar235);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar84 = ZEXT416((uint)local_5c0._0_4_);
                  auVar82 = ZEXT416((uint)local_7c0._0_4_);
                  auVar83 = _local_7a0;
                  auVar249 = local_5e0;
                  auVar85 = local_5d0;
                  fVar231 = local_5f0;
                  fVar207 = fStack_5ec;
                  fVar208 = fStack_5e8;
                  fVar209 = fStack_5e4;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar220 = auVar80._0_4_;
                  fVar207 = fVar231;
                  fVar208 = fVar231;
                  fVar209 = fVar231;
                }
                auVar246 = ZEXT1664(auVar83);
                auVar241 = ZEXT1664(local_700._0_16_);
                auVar237 = ZEXT1664(local_6e0._0_16_);
                auVar258 = ZEXT3264(local_8c0);
                auVar250 = ZEXT3264(local_8e0);
                auVar251 = ZEXT3264(local_900);
                auVar252 = ZEXT3264(local_920);
                auVar253 = ZEXT3264(local_7e0);
                auVar254 = ZEXT3264(local_940);
                auVar255 = ZEXT3264(local_800);
                auVar256 = ZEXT3264(local_960);
                auVar257 = ZEXT3264(local_820);
                auVar259 = ZEXT3264(local_840);
                auVar260 = ZEXT3264(local_860);
                auVar261 = ZEXT3264(local_8a0);
                auVar262 = ZEXT3264(local_980);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar211,local_880._0_16_);
                auVar80 = vfmadd231ss_fma(auVar211,local_880._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar139 = local_880._0_4_;
                auVar189._0_4_ = fVar139 * (float)local_6a0._0_4_;
                auVar189._4_4_ = fVar139 * (float)local_6a0._4_4_;
                auVar189._8_4_ = fVar139 * fStack_698;
                auVar189._12_4_ = fVar139 * fStack_694;
                auVar206._0_4_ = auVar80._0_4_;
                auVar206._4_4_ = auVar206._0_4_;
                auVar206._8_4_ = auVar206._0_4_;
                auVar206._12_4_ = auVar206._0_4_;
                auVar80 = vfmadd132ps_fma(auVar206,auVar189,local_660._0_16_);
                auVar169._0_4_ = auVar87._0_4_;
                auVar169._4_4_ = auVar169._0_4_;
                auVar169._8_4_ = auVar169._0_4_;
                auVar169._12_4_ = auVar169._0_4_;
                auVar80 = vfmadd132ps_fma(auVar169,auVar80,local_680._0_16_);
                auVar80 = vfmadd132ps_fma(_local_560,auVar80,local_640._0_16_);
                auVar170._0_4_ = auVar80._0_4_ * (float)local_580._0_4_;
                auVar170._4_4_ = auVar80._4_4_ * (float)local_580._0_4_;
                auVar170._8_4_ = auVar80._8_4_ * (float)local_580._0_4_;
                auVar170._12_4_ = auVar80._12_4_ * (float)local_580._0_4_;
                auVar80 = vdpps_avx(auVar83,auVar80,0x7f);
                fVar202 = auVar80._0_4_;
                auVar190._0_4_ = auVar83._0_4_ * fVar202;
                auVar190._4_4_ = auVar83._4_4_ * fVar202;
                auVar190._8_4_ = auVar83._8_4_ * fVar202;
                auVar190._12_4_ = auVar83._12_4_ * fVar202;
                auVar80 = vsubps_avx(auVar170,auVar190);
                fVar202 = (float)local_760._0_4_ * (float)local_5a0._0_4_;
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar86 = vxorps_avx512vl(auVar83,auVar18);
                auVar215._0_4_ = fVar231 * auVar80._0_4_ * fVar202;
                auVar215._4_4_ = fVar207 * auVar80._4_4_ * fVar202;
                auVar215._8_4_ = fVar208 * auVar80._8_4_ * fVar202;
                auVar215._12_4_ = fVar209 * auVar80._12_4_ * fVar202;
                auVar80 = vdpps_avx(auVar86,auVar249,0x7f);
                auVar211 = vmaxss_avx(ZEXT416((uint)fVar210),
                                      ZEXT416((uint)((float)local_780._0_4_ *
                                                    fVar219 * 1.9073486e-06)));
                auVar87 = vdivss_avx512f(ZEXT416((uint)fVar210),auVar84);
                auVar84 = vdpps_avx(local_6e0._0_16_,auVar215,0x7f);
                auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar210),auVar211);
                auVar87 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 + 1.0)),auVar87,auVar82);
                auVar82 = vdpps_avx(local_6b0,auVar249,0x7f);
                fVar231 = auVar80._0_4_ + auVar84._0_4_;
                auVar84 = vdpps_avx(local_6e0._0_16_,auVar86,0x7f);
                auVar86 = vmulss_avx512f(auVar85,ZEXT416((uint)(fVar235 * -0.5)));
                auVar85 = vmulss_avx512f(auVar85,auVar85);
                auVar80 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar86 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar86._0_4_ * auVar85._0_4_)));
                auVar85 = vfnmadd231ss_fma(auVar84,auVar88,ZEXT416((uint)fVar231));
                auVar81 = vfnmadd231ss_fma(auVar80,auVar88,auVar82);
                auVar84 = vpermilps_avx(local_540._0_16_,0xff);
                fVar220 = fVar220 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar83,auVar83,0xff);
                auVar80 = vfmsub213ss_fma(auVar85,auVar86,auVar84);
                fVar235 = auVar81._0_4_ * auVar86._0_4_;
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar80._0_4_)),
                                          ZEXT416((uint)fVar231),ZEXT416((uint)fVar235));
                fVar236 = auVar85._0_4_;
                fVar139 = fVar139 - (fVar234 * (fVar235 / fVar236) -
                                    fVar220 * (auVar82._0_4_ / fVar236));
                auVar224 = ZEXT464((uint)fVar139);
                fVar221 = (float)local_780._0_4_ -
                          (fVar220 * (fVar231 / fVar236) - fVar234 * (auVar80._0_4_ / fVar236));
                auVar233 = ZEXT464((uint)fVar221);
                auVar19._8_4_ = 0x7fffffff;
                auVar19._0_8_ = 0x7fffffff7fffffff;
                auVar19._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx512vl(auVar88,auVar19);
                fVar231 = (float)local_9a0._0_4_;
                fVar234 = (float)local_9a0._4_4_;
                fVar235 = fStack_998;
                fVar236 = fStack_994;
                fVar207 = fStack_990;
                fVar208 = fStack_98c;
                fVar209 = fStack_988;
                fVar202 = fStack_984;
                if (auVar82._0_4_ < auVar87._0_4_) {
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ + auVar211._0_4_)),
                                            local_600,ZEXT416(0x36000000));
                  auVar20._8_4_ = 0x7fffffff;
                  auVar20._0_8_ = 0x7fffffff7fffffff;
                  auVar20._12_4_ = 0x7fffffff;
                  auVar88 = vandps_avx512vl(ZEXT416((uint)fVar220),auVar20);
                  if (auVar88._0_4_ < auVar82._0_4_) {
                    fVar221 = fVar221 + (float)local_610._0_4_;
                    auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar221 < fVar138) {
                      bVar68 = 0;
                      goto LAB_01d6fce1;
                    }
                    fVar219 = *(float *)(ray + k * 4 + 0x80);
                    auVar233 = ZEXT464((uint)fVar219);
                    auVar230 = ZEXT3264(_local_720);
                    if (fVar221 <= fVar219) {
                      bVar68 = 0;
                      if ((fVar139 < 0.0) || (1.0 < fVar139)) goto LAB_01d6fcea;
                      auVar191._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar191._0_4_ = local_700._0_4_;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar191);
                      fVar220 = auVar82._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar75].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar68 = 0;
                        goto LAB_01d6fcea;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar68 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01d6fcea;
                      fVar220 = fVar220 * 1.5 + local_700._0_4_ * -0.5 * fVar220 * fVar220 * fVar220
                      ;
                      auVar192._0_4_ = local_6e0._0_4_ * fVar220;
                      auVar192._4_4_ = local_6e0._4_4_ * fVar220;
                      auVar192._8_4_ = local_6e0._8_4_ * fVar220;
                      auVar192._12_4_ = local_6e0._12_4_ * fVar220;
                      auVar80 = vfmadd213ps_fma(auVar84,auVar192,auVar83);
                      auVar82 = vshufps_avx(auVar192,auVar192,0xc9);
                      auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
                      auVar193._0_4_ = auVar192._0_4_ * auVar84._0_4_;
                      auVar193._4_4_ = auVar192._4_4_ * auVar84._4_4_;
                      auVar193._8_4_ = auVar192._8_4_ * auVar84._8_4_;
                      auVar193._12_4_ = auVar192._12_4_ * auVar84._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar193,auVar83,auVar82);
                      auVar82 = vshufps_avx(auVar88,auVar88,0xc9);
                      auVar84 = vshufps_avx(auVar80,auVar80,0xc9);
                      auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                      auVar146._0_4_ = auVar80._0_4_ * auVar88._0_4_;
                      auVar146._4_4_ = auVar80._4_4_ * auVar88._4_4_;
                      auVar146._8_4_ = auVar80._8_4_ * auVar88._8_4_;
                      auVar146._12_4_ = auVar80._12_4_ * auVar88._12_4_;
                      auVar82 = vfmsub231ps_fma(auVar146,auVar82,auVar84);
                      local_4e0 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                      auStack_4d0 = vshufps_avx(auVar82,auVar82,0xaa);
                      local_4c0 = auVar82._0_4_;
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      local_4b0 = fVar139;
                      fStack_4ac = fVar139;
                      fStack_4a8 = fVar139;
                      fStack_4a4 = fVar139;
                      local_4a0 = ZEXT416(0) << 0x20;
                      local_490 = local_4f0._0_8_;
                      uStack_488 = local_4f0._8_8_;
                      local_480 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_46c = context->user->instID[0];
                      local_470 = uStack_46c;
                      uStack_468 = uStack_46c;
                      uStack_464 = uStack_46c;
                      uStack_460 = context->user->instPrimID[0];
                      uStack_45c = uStack_460;
                      uStack_458 = uStack_460;
                      uStack_454 = uStack_460;
                      *(float *)(ray + k * 4 + 0x80) = fVar221;
                      local_9c0 = local_510;
                      local_750.valid = (int *)local_9c0;
                      local_750.geometryUserPtr = pGVar2->userPtr;
                      local_750.context = context->user;
                      local_750.hit = local_4e0;
                      local_750.N = 4;
                      local_750.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar237 = ZEXT1664(local_6e0._0_16_);
                        auVar241 = ZEXT1664(local_700._0_16_);
                        auVar246 = ZEXT1664(auVar83);
                        (*pGVar2->occlusionFilterN)(&local_750);
                        auVar230 = ZEXT3264(_local_720);
                        auVar262 = ZEXT3264(local_980);
                        auVar261 = ZEXT3264(local_8a0);
                        auVar260 = ZEXT3264(local_860);
                        auVar259 = ZEXT3264(local_840);
                        auVar257 = ZEXT3264(local_820);
                        auVar256 = ZEXT3264(local_960);
                        auVar255 = ZEXT3264(local_800);
                        auVar254 = ZEXT3264(local_940);
                        auVar253 = ZEXT3264(local_7e0);
                        auVar252 = ZEXT3264(local_920);
                        auVar251 = ZEXT3264(local_900);
                        auVar250 = ZEXT3264(local_8e0);
                        auVar258 = ZEXT3264(local_8c0);
                        auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        fVar231 = (float)local_9a0._0_4_;
                        fVar234 = (float)local_9a0._4_4_;
                        fVar235 = fStack_998;
                        fVar236 = fStack_994;
                        fVar207 = fStack_990;
                        fVar208 = fStack_98c;
                        fVar209 = fStack_988;
                        fVar202 = fStack_984;
                      }
                      uVar77 = vptestmd_avx512vl(local_9c0,local_9c0);
                      if ((uVar77 & 0xf) != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar237 = ZEXT1664(auVar237._0_16_);
                          auVar241 = ZEXT1664(auVar241._0_16_);
                          auVar246 = ZEXT1664(auVar246._0_16_);
                          (*p_Var3)(&local_750);
                          auVar230 = ZEXT3264(_local_720);
                          auVar262 = ZEXT3264(local_980);
                          auVar261 = ZEXT3264(local_8a0);
                          auVar260 = ZEXT3264(local_860);
                          auVar259 = ZEXT3264(local_840);
                          auVar257 = ZEXT3264(local_820);
                          auVar256 = ZEXT3264(local_960);
                          auVar255 = ZEXT3264(local_800);
                          auVar254 = ZEXT3264(local_940);
                          auVar253 = ZEXT3264(local_7e0);
                          auVar252 = ZEXT3264(local_920);
                          auVar251 = ZEXT3264(local_900);
                          auVar250 = ZEXT3264(local_8e0);
                          auVar258 = ZEXT3264(local_8c0);
                          auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          fVar231 = (float)local_9a0._0_4_;
                          fVar234 = (float)local_9a0._4_4_;
                          fVar235 = fStack_998;
                          fVar236 = fStack_994;
                          fVar207 = fStack_990;
                          fVar208 = fStack_98c;
                          fVar209 = fStack_988;
                          fVar202 = fStack_984;
                        }
                        auVar233 = ZEXT464((uint)fVar219);
                        uVar77 = vptestmd_avx512vl(local_9c0,local_9c0);
                        uVar77 = uVar77 & 0xf;
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar77 & 1);
                        auVar89._0_4_ =
                             (uint)bVar4 * auVar82._0_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x80);
                        bVar4 = (bool)((byte)(uVar77 >> 1) & 1);
                        auVar89._4_4_ =
                             (uint)bVar4 * auVar82._4_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x84);
                        bVar4 = (bool)((byte)(uVar77 >> 2) & 1);
                        auVar89._8_4_ =
                             (uint)bVar4 * auVar82._8_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x88);
                        bVar4 = SUB81(uVar77 >> 3,0);
                        auVar89._12_4_ =
                             (uint)bVar4 * auVar82._12_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x8c);
                        *(undefined1 (*) [16])(local_750.ray + 0x80) = auVar89;
                        bVar68 = 1;
                        if ((byte)uVar77 != 0) goto LAB_01d6fcea;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar219;
                    }
                    auVar233 = ZEXT464((uint)fVar219);
                    bVar68 = 0;
                    goto LAB_01d6fcea;
                  }
                }
                bVar76 = uVar77 < 4;
                uVar77 = uVar77 + 1;
              } while (uVar77 != 5);
              bVar76 = false;
              auVar224 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar68 = 5;
LAB_01d6fce1:
              auVar230 = ZEXT3264(_local_720);
LAB_01d6fcea:
              bVar74 = (bool)(bVar74 | bVar76 & bVar68);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar151._4_4_ = uVar159;
              auVar151._0_4_ = uVar159;
              auVar151._8_4_ = uVar159;
              auVar151._12_4_ = uVar159;
              auVar151._16_4_ = uVar159;
              auVar151._20_4_ = uVar159;
              auVar151._24_4_ = uVar159;
              auVar151._28_4_ = uVar159;
              auVar63._4_4_ = fStack_3bc;
              auVar63._0_4_ = local_3c0;
              auVar63._8_4_ = fStack_3b8;
              auVar63._12_4_ = fStack_3b4;
              auVar63._16_4_ = fStack_3b0;
              auVar63._20_4_ = fStack_3ac;
              auVar63._24_4_ = fStack_3a8;
              auVar63._28_4_ = fStack_3a4;
              uVar11 = vcmpps_avx512vl(auVar151,auVar63,0xd);
              bVar69 = ~('\x01' << ((byte)iVar14 & 0x1f)) & bVar69 & (byte)uVar11;
            } while (bVar69 != 0);
            auVar230 = ZEXT3264(local_360);
            auVar128 = local_3e0;
          }
          uVar12 = vpcmpgtd_avx512vl(auVar128,local_380);
          uVar13 = vpcmpd_avx512vl(local_380,local_300,1);
          auVar197._0_4_ = fVar231 + (float)local_1c0._0_4_;
          auVar197._4_4_ = fVar234 + (float)local_1c0._4_4_;
          auVar197._8_4_ = fVar235 + fStack_1b8;
          auVar197._12_4_ = fVar236 + fStack_1b4;
          auVar197._16_4_ = fVar207 + fStack_1b0;
          auVar197._20_4_ = fVar208 + fStack_1ac;
          auVar197._24_4_ = fVar209 + fStack_1a8;
          auVar197._28_4_ = fVar202 + fStack_1a4;
          uVar11 = vcmpps_avx512vl(auVar197,auVar151,2);
          bVar69 = (byte)local_9ac & (byte)uVar13 & (byte)uVar11;
          auVar198._0_4_ = fVar231 + auVar230._0_4_;
          auVar198._4_4_ = fVar234 + auVar230._4_4_;
          auVar198._8_4_ = fVar235 + auVar230._8_4_;
          auVar198._12_4_ = fVar236 + auVar230._12_4_;
          auVar198._16_4_ = fVar207 + auVar230._16_4_;
          auVar198._20_4_ = fVar208 + auVar230._20_4_;
          auVar198._24_4_ = fVar209 + auVar230._24_4_;
          auVar198._28_4_ = fVar202 + auVar230._28_4_;
          uVar11 = vcmpps_avx512vl(auVar198,auVar151,2);
          bVar66 = bVar66 & (byte)uVar12 & (byte)uVar11 | bVar69;
          prim = local_5b0;
          if (bVar66 != 0) {
            uVar73 = (ulong)uVar72;
            abStack_180[uVar73 * 0x60] = bVar66;
            auVar130._0_4_ =
                 (uint)(bVar69 & 1) * local_1c0._0_4_ |
                 (uint)!(bool)(bVar69 & 1) * (int)auVar230._0_4_;
            bVar76 = (bool)(bVar69 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar76 * local_1c0._4_4_ | (uint)!bVar76 * (int)auVar230._4_4_;
            bVar76 = (bool)(bVar69 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar76 * (int)fStack_1b8 | (uint)!bVar76 * (int)auVar230._8_4_;
            bVar76 = (bool)(bVar69 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar76 * (int)fStack_1b4 | (uint)!bVar76 * (int)auVar230._12_4_;
            bVar76 = (bool)(bVar69 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar76 * (int)fStack_1b0 | (uint)!bVar76 * (int)auVar230._16_4_;
            bVar76 = (bool)(bVar69 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar76 * (int)fStack_1ac | (uint)!bVar76 * (int)auVar230._20_4_;
            bVar76 = (bool)(bVar69 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar76 * (int)fStack_1a8 | (uint)!bVar76 * (int)auVar230._24_4_;
            auVar130._28_4_ =
                 (uint)(bVar69 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar69 >> 7) * (int)auVar230._28_4_;
            auVar230 = ZEXT3264(auVar130);
            *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x60) = auVar130;
            uVar77 = vmovlps_avx(local_390);
            (&uStack_140)[uVar73 * 0xc] = uVar77;
            aiStack_138[uVar73 * 0x18] = local_a18 + 1;
            uVar72 = uVar72 + 1;
          }
        }
      }
    }
    do {
      uVar79 = uVar72;
      uVar78 = uVar79 - 1;
      if (uVar79 == 0) {
        if (bVar74 != false) {
          return bVar74;
        }
        uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar32._4_4_ = uVar159;
        auVar32._0_4_ = uVar159;
        auVar32._8_4_ = uVar159;
        auVar32._12_4_ = uVar159;
        auVar32._16_4_ = uVar159;
        auVar32._20_4_ = uVar159;
        auVar32._24_4_ = uVar159;
        auVar32._28_4_ = uVar159;
        uVar11 = vcmpps_avx512vl(local_2e0,auVar32,2);
        uVar75 = (uint)local_5a8 & (uint)uVar11;
        local_5a8 = (ulong)uVar75;
        if (uVar75 == 0) {
          return false;
        }
        goto LAB_01d6d80a;
      }
      uVar77 = (ulong)uVar78;
      lVar71 = uVar77 * 0x60;
      auVar95 = *(undefined1 (*) [32])(auStack_160 + lVar71);
      auVar171._0_4_ = fVar231 + auVar95._0_4_;
      auVar171._4_4_ = fVar234 + auVar95._4_4_;
      auVar171._8_4_ = fVar235 + auVar95._8_4_;
      auVar171._12_4_ = fVar236 + auVar95._12_4_;
      auVar171._16_4_ = fVar207 + auVar95._16_4_;
      auVar171._20_4_ = fVar208 + auVar95._20_4_;
      auVar171._24_4_ = fVar209 + auVar95._24_4_;
      auVar171._28_4_ = fVar202 + auVar95._28_4_;
      uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31._4_4_ = uVar159;
      auVar31._0_4_ = uVar159;
      auVar31._8_4_ = uVar159;
      auVar31._12_4_ = uVar159;
      auVar31._16_4_ = uVar159;
      auVar31._20_4_ = uVar159;
      auVar31._24_4_ = uVar159;
      auVar31._28_4_ = uVar159;
      uVar11 = vcmpps_avx512vl(auVar171,auVar31,2);
      uVar131 = (uint)uVar11 & (uint)abStack_180[lVar71];
      uVar72 = uVar78;
    } while (uVar131 == 0);
    uVar73 = (&uStack_140)[uVar77 * 0xc];
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar73;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar93 = vblendmps_avx512vl(auVar196,auVar95);
    bVar66 = (byte)uVar131;
    auVar126._0_4_ =
         (uint)(bVar66 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)auVar95._0_4_;
    bVar76 = (bool)((byte)(uVar131 >> 1) & 1);
    auVar126._4_4_ = (uint)bVar76 * auVar93._4_4_ | (uint)!bVar76 * (int)auVar95._4_4_;
    bVar76 = (bool)((byte)(uVar131 >> 2) & 1);
    auVar126._8_4_ = (uint)bVar76 * auVar93._8_4_ | (uint)!bVar76 * (int)auVar95._8_4_;
    bVar76 = (bool)((byte)(uVar131 >> 3) & 1);
    auVar126._12_4_ = (uint)bVar76 * auVar93._12_4_ | (uint)!bVar76 * (int)auVar95._12_4_;
    bVar76 = (bool)((byte)(uVar131 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar76 * auVar93._16_4_ | (uint)!bVar76 * (int)auVar95._16_4_;
    bVar76 = (bool)((byte)(uVar131 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar76 * auVar93._20_4_ | (uint)!bVar76 * (int)auVar95._20_4_;
    bVar76 = (bool)((byte)(uVar131 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar76 * auVar93._24_4_ | (uint)!bVar76 * (int)auVar95._24_4_;
    auVar126._28_4_ =
         (uVar131 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar131 >> 7,0) * (int)auVar95._28_4_;
    auVar95 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar95 = vminps_avx(auVar126,auVar95);
    auVar93 = vshufpd_avx(auVar95,auVar95,5);
    auVar95 = vminps_avx(auVar95,auVar93);
    auVar93 = vpermpd_avx2(auVar95,0x4e);
    auVar95 = vminps_avx(auVar95,auVar93);
    uVar11 = vcmpps_avx512vl(auVar126,auVar95,0);
    bVar69 = (byte)uVar11 & bVar66;
    if (bVar69 != 0) {
      uVar131 = (uint)bVar69;
    }
    uVar132 = 0;
    for (; (uVar131 & 1) == 0; uVar131 = uVar131 >> 1 | 0x80000000) {
      uVar132 = uVar132 + 1;
    }
    local_a18 = aiStack_138[uVar77 * 0x18];
    bVar66 = ~('\x01' << ((byte)uVar132 & 0x1f)) & bVar66;
    abStack_180[lVar71] = bVar66;
    uVar72 = uVar79;
    if (bVar66 == 0) {
      uVar72 = uVar78;
    }
    uVar159 = (undefined4)uVar73;
    auVar148._4_4_ = uVar159;
    auVar148._0_4_ = uVar159;
    auVar148._8_4_ = uVar159;
    auVar148._12_4_ = uVar159;
    auVar148._16_4_ = uVar159;
    auVar148._20_4_ = uVar159;
    auVar148._24_4_ = uVar159;
    auVar148._28_4_ = uVar159;
    auVar82 = vmovshdup_avx(auVar160);
    auVar82 = vsubps_avx(auVar82,auVar160);
    auVar172._0_4_ = auVar82._0_4_;
    auVar172._4_4_ = auVar172._0_4_;
    auVar172._8_4_ = auVar172._0_4_;
    auVar172._12_4_ = auVar172._0_4_;
    auVar172._16_4_ = auVar172._0_4_;
    auVar172._20_4_ = auVar172._0_4_;
    auVar172._24_4_ = auVar172._0_4_;
    auVar172._28_4_ = auVar172._0_4_;
    auVar82 = vfmadd132ps_fma(auVar172,auVar148,_DAT_01faff20);
    _local_4e0 = ZEXT1632(auVar82);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar132 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }